

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_hn<embree::avx2::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  long lVar5;
  __int_type_conflict _Var6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  uint uVar47;
  uint uVar48;
  ulong uVar49;
  long lVar51;
  byte bVar52;
  uint uVar53;
  ulong uVar54;
  ulong uVar55;
  uint uVar56;
  undefined4 uVar57;
  undefined8 unaff_RBP;
  bool bVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar89;
  float fVar91;
  vint4 bi_2;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar90;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined8 uVar92;
  vint4 bi_1;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar119;
  vint4 ai_2;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  vint4 ai;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  float fVar143;
  float fVar144;
  float fVar156;
  float fVar157;
  vint4 bi;
  undefined1 auVar145 [16];
  float fVar158;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  vint4 ai_1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  float fVar175;
  float fVar189;
  float fVar190;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  __m128 a_1;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar216;
  vfloat4 a0_1;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar227;
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  vfloat4 a0;
  undefined1 auVar239 [16];
  undefined1 auVar238 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar264 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_53c;
  undefined1 local_538 [16];
  undefined1 local_528 [8];
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  long local_4d8;
  Primitive *local_4d0;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [16];
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [32];
  Precalculations *local_3a8;
  ulong local_3a0;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 auStack_388 [16];
  undefined1 local_378 [32];
  RTCFilterFunctionNArguments local_358;
  uint local_328;
  uint uStack_324;
  uint uStack_320;
  uint uStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  uint auStack_2e8 [4];
  undefined8 local_2d8;
  undefined4 local_2d0;
  undefined8 local_2cc;
  undefined4 local_2c4;
  uint local_2c0;
  uint local_2bc;
  uint local_2b8;
  undefined1 local_2a8 [32];
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  uint uStack_1d8;
  float afStack_1d4 [7];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ulong auStack_58 [5];
  ulong uVar50;
  undefined1 auVar263 [32];
  
  PVar3 = prim[1];
  uVar49 = (ulong)(byte)PVar3;
  fVar59 = *(float *)(prim + uVar49 * 0x19 + 0x12);
  auVar12 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar49 * 0x19 + 6));
  auVar159._0_4_ = fVar59 * (ray->dir).field_0.m128[0];
  auVar159._4_4_ = fVar59 * (ray->dir).field_0.m128[1];
  auVar159._8_4_ = fVar59 * (ray->dir).field_0.m128[2];
  auVar159._12_4_ = fVar59 * (ray->dir).field_0.m128[3];
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 4 + 6)));
  auVar62._0_4_ = fVar59 * auVar12._0_4_;
  auVar62._4_4_ = fVar59 * auVar12._4_4_;
  auVar62._8_4_ = fVar59 * auVar12._8_4_;
  auVar62._12_4_ = fVar59 * auVar12._12_4_;
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 6 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0xb + 6)));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0xc + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar239 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0xd + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0x12 + 6)));
  auVar239 = vcvtdq2ps_avx(auVar239);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0x13 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar230 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0x14 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar230 = vcvtdq2ps_avx(auVar230);
  auVar253._4_4_ = auVar159._0_4_;
  auVar253._0_4_ = auVar159._0_4_;
  auVar253._8_4_ = auVar159._0_4_;
  auVar253._12_4_ = auVar159._0_4_;
  auVar108 = vshufps_avx(auVar159,auVar159,0x55);
  auVar63 = vshufps_avx(auVar159,auVar159,0xaa);
  fVar59 = auVar63._0_4_;
  auVar217._0_4_ = fVar59 * auVar127._0_4_;
  fVar89 = auVar63._4_4_;
  auVar217._4_4_ = fVar89 * auVar127._4_4_;
  fVar119 = auVar63._8_4_;
  auVar217._8_4_ = fVar119 * auVar127._8_4_;
  fVar90 = auVar63._12_4_;
  auVar217._12_4_ = fVar90 * auVar127._12_4_;
  auVar201._0_4_ = auVar239._0_4_ * fVar59;
  auVar201._4_4_ = auVar239._4_4_ * fVar89;
  auVar201._8_4_ = auVar239._8_4_ * fVar119;
  auVar201._12_4_ = auVar239._12_4_ * fVar90;
  auVar191._0_4_ = auVar230._0_4_ * fVar59;
  auVar191._4_4_ = auVar230._4_4_ * fVar89;
  auVar191._8_4_ = auVar230._8_4_ * fVar119;
  auVar191._12_4_ = auVar230._12_4_ * fVar90;
  auVar63 = vfmadd231ps_fma(auVar217,auVar108,auVar12);
  auVar124 = vfmadd231ps_fma(auVar201,auVar108,auVar11);
  auVar108 = vfmadd231ps_fma(auVar191,auVar64,auVar108);
  auVar120 = vfmadd231ps_fma(auVar63,auVar253,auVar9);
  auVar124 = vfmadd231ps_fma(auVar124,auVar253,auVar10);
  auVar133 = vfmadd231ps_fma(auVar108,auVar65,auVar253);
  auVar254._4_4_ = auVar62._0_4_;
  auVar254._0_4_ = auVar62._0_4_;
  auVar254._8_4_ = auVar62._0_4_;
  auVar254._12_4_ = auVar62._0_4_;
  auVar108 = vshufps_avx(auVar62,auVar62,0x55);
  auVar63 = vshufps_avx(auVar62,auVar62,0xaa);
  fVar59 = auVar63._0_4_;
  auVar160._0_4_ = fVar59 * auVar127._0_4_;
  fVar89 = auVar63._4_4_;
  auVar160._4_4_ = fVar89 * auVar127._4_4_;
  fVar119 = auVar63._8_4_;
  auVar160._8_4_ = fVar119 * auVar127._8_4_;
  fVar90 = auVar63._12_4_;
  auVar160._12_4_ = fVar90 * auVar127._12_4_;
  auVar93._0_4_ = auVar239._0_4_ * fVar59;
  auVar93._4_4_ = auVar239._4_4_ * fVar89;
  auVar93._8_4_ = auVar239._8_4_ * fVar119;
  auVar93._12_4_ = auVar239._12_4_ * fVar90;
  auVar63._0_4_ = auVar230._0_4_ * fVar59;
  auVar63._4_4_ = auVar230._4_4_ * fVar89;
  auVar63._8_4_ = auVar230._8_4_ * fVar119;
  auVar63._12_4_ = auVar230._12_4_ * fVar90;
  auVar12 = vfmadd231ps_fma(auVar160,auVar108,auVar12);
  auVar127 = vfmadd231ps_fma(auVar93,auVar108,auVar11);
  auVar11 = vfmadd231ps_fma(auVar63,auVar108,auVar64);
  auVar64 = vfmadd231ps_fma(auVar12,auVar254,auVar9);
  auVar230 = vfmadd231ps_fma(auVar127,auVar254,auVar10);
  local_318._8_4_ = 0x7fffffff;
  local_318._0_8_ = 0x7fffffff7fffffff;
  local_318._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx(auVar120,local_318);
  auVar176._8_4_ = 0x219392ef;
  auVar176._0_8_ = 0x219392ef219392ef;
  auVar176._12_4_ = 0x219392ef;
  auVar9 = vcmpps_avx(auVar9,auVar176,1);
  auVar12 = vblendvps_avx(auVar120,auVar176,auVar9);
  auVar9 = vandps_avx(auVar124,local_318);
  auVar9 = vcmpps_avx(auVar9,auVar176,1);
  auVar127 = vblendvps_avx(auVar124,auVar176,auVar9);
  auVar9 = vandps_avx(auVar133,local_318);
  auVar9 = vcmpps_avx(auVar9,auVar176,1);
  auVar9 = vblendvps_avx(auVar133,auVar176,auVar9);
  auVar108 = vfmadd231ps_fma(auVar11,auVar254,auVar65);
  auVar10 = vrcpps_avx(auVar12);
  auVar177._8_4_ = 0x3f800000;
  auVar177._0_8_ = 0x3f8000003f800000;
  auVar177._12_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar12,auVar10,auVar177);
  auVar10 = vfmadd132ps_fma(auVar12,auVar10,auVar10);
  auVar12 = vrcpps_avx(auVar127);
  auVar127 = vfnmadd213ps_fma(auVar127,auVar12,auVar177);
  auVar239 = vfmadd132ps_fma(auVar127,auVar12,auVar12);
  auVar12 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar12,auVar177);
  auVar65 = vfmadd132ps_fma(auVar9,auVar12,auVar12);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar49 * 7 + 6);
  auVar9 = vpmovsxwd_avx(auVar9);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar64);
  auVar133._0_4_ = auVar10._0_4_ * auVar9._0_4_;
  auVar133._4_4_ = auVar10._4_4_ * auVar9._4_4_;
  auVar133._8_4_ = auVar10._8_4_ * auVar9._8_4_;
  auVar133._12_4_ = auVar10._12_4_ * auVar9._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar49 * 9 + 6);
  auVar9 = vpmovsxwd_avx(auVar12);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar64);
  auVar145._0_4_ = auVar10._0_4_ * auVar9._0_4_;
  auVar145._4_4_ = auVar10._4_4_ * auVar9._4_4_;
  auVar145._8_4_ = auVar10._8_4_ * auVar9._8_4_;
  auVar145._12_4_ = auVar10._12_4_ * auVar9._12_4_;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + uVar49 * 0xe + 6);
  auVar9 = vpmovsxwd_avx(auVar127);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar230);
  auVar161._0_4_ = auVar239._0_4_ * auVar9._0_4_;
  auVar161._4_4_ = auVar239._4_4_ * auVar9._4_4_;
  auVar161._8_4_ = auVar239._8_4_ * auVar9._8_4_;
  auVar161._12_4_ = auVar239._12_4_ * auVar9._12_4_;
  auVar124._1_3_ = 0;
  auVar124[0] = PVar3;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar10);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar12 = vsubps_avx(auVar9,auVar230);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar49 * 0x15 + 6);
  auVar9 = vpmovsxwd_avx(auVar11);
  auVar230._0_4_ = auVar239._0_4_ * auVar12._0_4_;
  auVar230._4_4_ = auVar239._4_4_ * auVar12._4_4_;
  auVar230._8_4_ = auVar239._8_4_ * auVar12._8_4_;
  auVar230._12_4_ = auVar239._12_4_ * auVar12._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar108);
  auVar120._0_4_ = auVar65._0_4_ * auVar9._0_4_;
  auVar120._4_4_ = auVar65._4_4_ * auVar9._4_4_;
  auVar120._8_4_ = auVar65._8_4_ * auVar9._8_4_;
  auVar120._12_4_ = auVar65._12_4_ * auVar9._12_4_;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = *(ulong *)(prim + uVar49 * 0x17 + 6);
  auVar9 = vpmovsxwd_avx(auVar239);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar108);
  auVar64._0_4_ = auVar65._0_4_ * auVar9._0_4_;
  auVar64._4_4_ = auVar65._4_4_ * auVar9._4_4_;
  auVar64._8_4_ = auVar65._8_4_ * auVar9._8_4_;
  auVar64._12_4_ = auVar65._12_4_ * auVar9._12_4_;
  auVar9 = vpminsd_avx(auVar133,auVar145);
  auVar12 = vpminsd_avx(auVar161,auVar230);
  auVar9 = vmaxps_avx(auVar9,auVar12);
  auVar12 = vpminsd_avx(auVar120,auVar64);
  uVar57 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar202._4_4_ = uVar57;
  auVar202._0_4_ = uVar57;
  auVar202._8_4_ = uVar57;
  auVar202._12_4_ = uVar57;
  auVar12 = vmaxps_avx(auVar12,auVar202);
  auVar9 = vmaxps_avx(auVar9,auVar12);
  local_248._0_4_ = auVar9._0_4_ * 0.99999964;
  local_248._4_4_ = auVar9._4_4_ * 0.99999964;
  local_248._8_4_ = auVar9._8_4_ * 0.99999964;
  local_248._12_4_ = auVar9._12_4_ * 0.99999964;
  auVar9 = vpmaxsd_avx(auVar133,auVar145);
  auVar12 = vpmaxsd_avx(auVar161,auVar230);
  auVar9 = vminps_avx(auVar9,auVar12);
  auVar12 = vpmaxsd_avx(auVar120,auVar64);
  fVar59 = ray->tfar;
  auVar108._4_4_ = fVar59;
  auVar108._0_4_ = fVar59;
  auVar108._8_4_ = fVar59;
  auVar108._12_4_ = fVar59;
  auVar12 = vminps_avx(auVar12,auVar108);
  auVar9 = vminps_avx(auVar9,auVar12);
  auVar65._0_4_ = auVar9._0_4_ * 1.0000004;
  auVar65._4_4_ = auVar9._4_4_ * 1.0000004;
  auVar65._8_4_ = auVar9._8_4_ * 1.0000004;
  auVar65._12_4_ = auVar9._12_4_ * 1.0000004;
  auVar124[4] = PVar3;
  auVar124._5_3_ = 0;
  auVar124[8] = PVar3;
  auVar124._9_3_ = 0;
  auVar124[0xc] = PVar3;
  auVar124._13_3_ = 0;
  auVar12 = vpcmpgtd_avx(auVar124,_DAT_01f4ad30);
  auVar9 = vcmpps_avx(local_248,auVar65,2);
  auVar9 = vandps_avx(auVar9,auVar12);
  uVar57 = vmovmskps_avx(auVar9);
  uVar49 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar57);
  auVar86._16_16_ = mm_lookupmask_ps._240_16_;
  auVar86._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar86,ZEXT832(0) << 0x20,0x80);
  local_3a8 = pre;
LAB_01158b04:
  if (uVar49 == 0) {
LAB_0115a5f0:
    return uVar49 != 0;
  }
  lVar51 = 0;
  for (uVar54 = uVar49; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    lVar51 = lVar51 + 1;
  }
  uVar48 = *(uint *)(prim + 2);
  local_3a0 = (ulong)*(uint *)(prim + lVar51 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar48].ptr;
  lVar5 = *(long *)&pGVar4[1].time_range.upper;
  uVar54 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           local_3a0 *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar9 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * uVar54);
  lVar51 = uVar54 + 1;
  auVar12 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * lVar51);
  _Var6 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar127 = *(undefined1 (*) [16])(_Var6 + (long)pGVar4[2].userPtr * uVar54);
  auVar10 = *(undefined1 (*) [16])(_Var6 + (long)pGVar4[2].userPtr * lVar51);
  auVar66._8_4_ = 0x3eaaaaab;
  auVar66._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar66._12_4_ = 0x3eaaaaab;
  auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar4[2].intersectionFilterN +
                             (long)pGVar4[2].pointQueryFunc * uVar54),auVar9,auVar66);
  auVar230 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                               (pGVar4[2].intersectionFilterN +
                               (long)pGVar4[2].pointQueryFunc * lVar51),auVar12,auVar66);
  auVar239 = vfmadd132ps_fma(*(undefined1 (*) [16])
                              ((long)pGVar4[3].userPtr +
                              uVar54 * *(long *)&pGVar4[3].fnumTimeSegments),auVar127,auVar66);
  auVar108 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                               ((long)pGVar4[3].userPtr +
                               *(long *)&pGVar4[3].fnumTimeSegments * lVar51),auVar10,auVar66);
  auVar124 = ZEXT816(0) << 0x40;
  auVar67._0_4_ = auVar12._0_4_ * 0.0;
  auVar67._4_4_ = auVar12._4_4_ * 0.0;
  auVar67._8_4_ = auVar12._8_4_ * 0.0;
  auVar67._12_4_ = auVar12._12_4_ * 0.0;
  auVar64 = vfmadd231ps_fma(auVar67,auVar230,auVar124);
  auVar65 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar11,auVar64);
  local_528._0_4_ = auVar9._0_4_ + auVar65._0_4_;
  local_528._4_4_ = auVar9._4_4_ + auVar65._4_4_;
  uStack_520._0_4_ = auVar9._8_4_ + auVar65._8_4_;
  uStack_520._4_4_ = auVar9._12_4_ + auVar65._12_4_;
  auVar246._8_4_ = 0x40400000;
  auVar246._0_8_ = 0x4040000040400000;
  auVar246._12_4_ = 0x40400000;
  auVar65 = vfmadd231ps_fma(auVar64,auVar11,auVar246);
  auVar63 = vfnmadd231ps_fma(auVar65,auVar9,auVar246);
  auVar203._0_4_ = auVar10._0_4_ * 0.0;
  auVar203._4_4_ = auVar10._4_4_ * 0.0;
  auVar203._8_4_ = auVar10._8_4_ * 0.0;
  auVar203._12_4_ = auVar10._12_4_ * 0.0;
  auVar64 = vfmadd231ps_fma(auVar203,auVar108,auVar124);
  auVar65 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar239,auVar64);
  auVar238._0_4_ = auVar127._0_4_ + auVar65._0_4_;
  auVar238._4_4_ = auVar127._4_4_ + auVar65._4_4_;
  auVar238._8_4_ = auVar127._8_4_ + auVar65._8_4_;
  auVar238._12_4_ = auVar127._12_4_ + auVar65._12_4_;
  auVar65 = vfmadd231ps_fma(auVar64,auVar239,auVar246);
  auVar64 = vfnmadd231ps_fma(auVar65,auVar127,auVar246);
  auVar65 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar230,auVar12);
  auVar65 = vfmadd231ps_fma(auVar65,auVar11,auVar124);
  auVar65 = vfmadd231ps_fma(auVar65,auVar9,auVar124);
  auVar121._0_4_ = auVar12._0_4_ * 3.0;
  auVar121._4_4_ = auVar12._4_4_ * 3.0;
  auVar121._8_4_ = auVar12._8_4_ * 3.0;
  auVar121._12_4_ = auVar12._12_4_ * 3.0;
  auVar12 = vfnmadd231ps_fma(auVar121,auVar246,auVar230);
  auVar12 = vfmadd231ps_fma(auVar12,auVar124,auVar11);
  auVar230 = vfnmadd231ps_fma(auVar12,auVar124,auVar9);
  auVar9 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar108,auVar10);
  auVar9 = vfmadd231ps_fma(auVar9,auVar239,auVar124);
  auVar11 = vfmadd231ps_fma(auVar9,auVar127,auVar124);
  auVar162._0_4_ = auVar10._0_4_ * 3.0;
  auVar162._4_4_ = auVar10._4_4_ * 3.0;
  auVar162._8_4_ = auVar10._8_4_ * 3.0;
  auVar162._12_4_ = auVar10._12_4_ * 3.0;
  auVar9 = vfnmadd231ps_fma(auVar162,auVar246,auVar108);
  auVar9 = vfmadd231ps_fma(auVar9,auVar124,auVar239);
  auVar239 = vfnmadd231ps_fma(auVar9,auVar124,auVar127);
  auVar9 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar12 = vshufps_avx(auVar238,auVar238,0xc9);
  fVar60 = auVar63._0_4_;
  auVar178._0_4_ = fVar60 * auVar12._0_4_;
  fVar175 = auVar63._4_4_;
  auVar178._4_4_ = fVar175 * auVar12._4_4_;
  fVar189 = auVar63._8_4_;
  auVar178._8_4_ = fVar189 * auVar12._8_4_;
  fVar190 = auVar63._12_4_;
  auVar178._12_4_ = fVar190 * auVar12._12_4_;
  auVar12 = vfmsub231ps_fma(auVar178,auVar9,auVar238);
  auVar127 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar12 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar192._0_4_ = auVar12._0_4_ * fVar60;
  auVar192._4_4_ = auVar12._4_4_ * fVar175;
  auVar192._8_4_ = auVar12._8_4_ * fVar189;
  auVar192._12_4_ = auVar12._12_4_ * fVar190;
  auVar9 = vfmsub231ps_fma(auVar192,auVar9,auVar64);
  auVar10 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar230,auVar230,0xc9);
  auVar12 = vshufps_avx(auVar11,auVar11,0xc9);
  fVar59 = auVar230._0_4_;
  auVar204._0_4_ = auVar12._0_4_ * fVar59;
  fVar89 = auVar230._4_4_;
  auVar204._4_4_ = auVar12._4_4_ * fVar89;
  fVar119 = auVar230._8_4_;
  auVar204._8_4_ = auVar12._8_4_ * fVar119;
  fVar90 = auVar230._12_4_;
  auVar204._12_4_ = auVar12._12_4_ * fVar90;
  auVar12 = vfmsub231ps_fma(auVar204,auVar9,auVar11);
  auVar11 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar12 = vshufps_avx(auVar239,auVar239,0xc9);
  auVar205._0_4_ = auVar12._0_4_ * fVar59;
  auVar205._4_4_ = auVar12._4_4_ * fVar89;
  auVar205._8_4_ = auVar12._8_4_ * fVar119;
  auVar205._12_4_ = auVar12._12_4_ * fVar90;
  auVar12 = vfmsub231ps_fma(auVar205,auVar9,auVar239);
  auVar9 = vdpps_avx(auVar127,auVar127,0x7f);
  auVar239 = vshufps_avx(auVar12,auVar12,0xc9);
  fVar61 = auVar9._0_4_;
  auVar206._4_12_ = ZEXT812(0) << 0x20;
  auVar206._0_4_ = fVar61;
  auVar12 = vrsqrtss_avx(auVar206,auVar206);
  fVar91 = auVar12._0_4_;
  auVar12 = vdpps_avx(auVar127,auVar10,0x7f);
  fVar144 = fVar91 * 1.5 - fVar61 * 0.5 * fVar91 * fVar91 * fVar91;
  fVar143 = fVar144 * auVar127._0_4_;
  fVar156 = fVar144 * auVar127._4_4_;
  fVar157 = fVar144 * auVar127._8_4_;
  fVar158 = fVar144 * auVar127._12_4_;
  auVar193._0_4_ = fVar61 * auVar10._0_4_;
  auVar193._4_4_ = fVar61 * auVar10._4_4_;
  auVar193._8_4_ = fVar61 * auVar10._8_4_;
  auVar193._12_4_ = fVar61 * auVar10._12_4_;
  fVar91 = auVar12._0_4_;
  auVar179._0_4_ = fVar91 * auVar127._0_4_;
  auVar179._4_4_ = fVar91 * auVar127._4_4_;
  auVar179._8_4_ = fVar91 * auVar127._8_4_;
  auVar179._12_4_ = fVar91 * auVar127._12_4_;
  auVar127 = vsubps_avx(auVar193,auVar179);
  auVar12 = vrcpss_avx(auVar206,auVar206);
  auVar9 = vfnmadd213ss_fma(auVar9,auVar12,SUB6416(ZEXT464(0x40000000),0));
  fVar91 = auVar12._0_4_ * auVar9._0_4_;
  auVar9 = vdpps_avx(auVar11,auVar11,0x7f);
  fVar61 = auVar9._0_4_;
  auVar194._4_12_ = ZEXT812(0) << 0x20;
  auVar194._0_4_ = fVar61;
  auVar12 = vrsqrtss_avx(auVar194,auVar194);
  fVar216 = auVar12._0_4_;
  fVar216 = fVar216 * 1.5 - fVar61 * 0.5 * fVar216 * fVar216 * fVar216;
  fVar227 = fVar216 * auVar11._0_4_;
  fVar235 = fVar216 * auVar11._4_4_;
  fVar236 = fVar216 * auVar11._8_4_;
  fVar237 = fVar216 * auVar11._12_4_;
  auVar12 = vdpps_avx(auVar11,auVar239,0x7f);
  auVar163._0_4_ = fVar61 * auVar239._0_4_;
  auVar163._4_4_ = fVar61 * auVar239._4_4_;
  auVar163._8_4_ = fVar61 * auVar239._8_4_;
  auVar163._12_4_ = fVar61 * auVar239._12_4_;
  fVar61 = auVar12._0_4_;
  auVar134._0_4_ = fVar61 * auVar11._0_4_;
  auVar134._4_4_ = fVar61 * auVar11._4_4_;
  auVar134._8_4_ = fVar61 * auVar11._8_4_;
  auVar134._12_4_ = fVar61 * auVar11._12_4_;
  auVar10 = vsubps_avx(auVar163,auVar134);
  auVar12 = vrcpss_avx(auVar194,auVar194);
  auVar9 = vfnmadd213ss_fma(auVar9,auVar12,SUB6416(ZEXT464(0x40000000),0));
  fVar61 = auVar9._0_4_ * auVar12._0_4_;
  auVar9 = vshufps_avx(_local_528,_local_528,0xff);
  auVar195._0_4_ = auVar9._0_4_ * fVar143;
  auVar195._4_4_ = auVar9._4_4_ * fVar156;
  auVar195._8_4_ = auVar9._8_4_ * fVar157;
  auVar195._12_4_ = auVar9._12_4_ * fVar158;
  local_458 = vsubps_avx(_local_528,auVar195);
  auVar12 = vshufps_avx(auVar63,auVar63,0xff);
  auVar146._0_4_ = auVar12._0_4_ * fVar143 + auVar9._0_4_ * fVar144 * fVar91 * auVar127._0_4_;
  auVar146._4_4_ = auVar12._4_4_ * fVar156 + auVar9._4_4_ * fVar144 * fVar91 * auVar127._4_4_;
  auVar146._8_4_ = auVar12._8_4_ * fVar157 + auVar9._8_4_ * fVar144 * fVar91 * auVar127._8_4_;
  auVar146._12_4_ = auVar12._12_4_ * fVar158 + auVar9._12_4_ * fVar144 * fVar91 * auVar127._12_4_;
  auVar127 = vsubps_avx(auVar63,auVar146);
  local_468._0_4_ = auVar195._0_4_ + (float)local_528._0_4_;
  local_468._4_4_ = auVar195._4_4_ + (float)local_528._4_4_;
  fStack_460 = auVar195._8_4_ + (float)uStack_520;
  fStack_45c = auVar195._12_4_ + uStack_520._4_4_;
  auVar9 = vshufps_avx(auVar65,auVar65,0xff);
  auVar94._0_4_ = fVar227 * auVar9._0_4_;
  auVar94._4_4_ = fVar235 * auVar9._4_4_;
  auVar94._8_4_ = fVar236 * auVar9._8_4_;
  auVar94._12_4_ = fVar237 * auVar9._12_4_;
  local_478 = vsubps_avx(auVar65,auVar94);
  auVar12 = vshufps_avx(auVar230,auVar230,0xff);
  auVar68._0_4_ = fVar227 * auVar12._0_4_ + auVar9._0_4_ * fVar216 * auVar10._0_4_ * fVar61;
  auVar68._4_4_ = fVar235 * auVar12._4_4_ + auVar9._4_4_ * fVar216 * auVar10._4_4_ * fVar61;
  auVar68._8_4_ = fVar236 * auVar12._8_4_ + auVar9._8_4_ * fVar216 * auVar10._8_4_ * fVar61;
  auVar68._12_4_ = fVar237 * auVar12._12_4_ + auVar9._12_4_ * fVar216 * auVar10._12_4_ * fVar61;
  auVar9 = vsubps_avx(auVar230,auVar68);
  local_4c8 = auVar65._0_4_ + auVar94._0_4_;
  fStack_4c4 = auVar65._4_4_ + auVar94._4_4_;
  fStack_4c0 = auVar65._8_4_ + auVar94._8_4_;
  fStack_4bc = auVar65._12_4_ + auVar94._12_4_;
  local_488._0_4_ = local_458._0_4_ + auVar127._0_4_ * 0.33333334;
  local_488._4_4_ = local_458._4_4_ + auVar127._4_4_ * 0.33333334;
  local_488._8_4_ = local_458._8_4_ + auVar127._8_4_ * 0.33333334;
  local_488._12_4_ = local_458._12_4_ + auVar127._12_4_ * 0.33333334;
  auVar69._0_4_ = auVar9._0_4_ * 0.33333334;
  auVar69._4_4_ = auVar9._4_4_ * 0.33333334;
  auVar69._8_4_ = auVar9._8_4_ * 0.33333334;
  auVar69._12_4_ = auVar9._12_4_ * 0.33333334;
  local_498 = vsubps_avx(local_478,auVar69);
  aVar1 = (ray->org).field_0;
  auVar127 = vsubps_avx(local_458,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar127,auVar127,0x55);
  auVar12 = vshufps_avx(auVar127,auVar127,0xaa);
  aVar2 = (pre->ray_space).vy.field_0;
  fVar91 = (pre->ray_space).vz.field_0.m128[0];
  fVar61 = (pre->ray_space).vz.field_0.m128[1];
  fVar144 = (pre->ray_space).vz.field_0.m128[2];
  fVar216 = (pre->ray_space).vz.field_0.m128[3];
  auVar135._0_4_ = fVar91 * auVar12._0_4_;
  auVar135._4_4_ = fVar61 * auVar12._4_4_;
  auVar135._8_4_ = fVar144 * auVar12._8_4_;
  auVar135._12_4_ = fVar216 * auVar12._12_4_;
  auVar108 = vfmadd231ps_fma(auVar135,(undefined1  [16])aVar2,auVar9);
  auVar10 = vsubps_avx(local_488,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar10,auVar10,0x55);
  auVar12 = vshufps_avx(auVar10,auVar10,0xaa);
  auVar70._0_4_ = fVar91 * auVar12._0_4_;
  auVar70._4_4_ = fVar61 * auVar12._4_4_;
  auVar70._8_4_ = fVar144 * auVar12._8_4_;
  auVar70._12_4_ = fVar216 * auVar12._12_4_;
  auVar63 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar2,auVar9);
  auVar12 = vsubps_avx(local_498,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar12,auVar12,0xaa);
  auVar109._0_4_ = fVar91 * auVar9._0_4_;
  auVar109._4_4_ = fVar61 * auVar9._4_4_;
  auVar109._8_4_ = fVar144 * auVar9._8_4_;
  auVar109._12_4_ = fVar216 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar12,auVar12,0x55);
  auVar124 = vfmadd231ps_fma(auVar109,(undefined1  [16])aVar2,auVar9);
  auVar11 = vsubps_avx(local_478,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar11,auVar11,0xaa);
  auVar122._0_4_ = fVar91 * auVar9._0_4_;
  auVar122._4_4_ = fVar61 * auVar9._4_4_;
  auVar122._8_4_ = fVar144 * auVar9._8_4_;
  auVar122._12_4_ = fVar216 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar11,auVar11,0x55);
  auVar120 = vfmadd231ps_fma(auVar122,(undefined1  [16])aVar2,auVar9);
  auVar239 = vsubps_avx(_local_468,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar239,auVar239,0xaa);
  auVar95._0_4_ = fVar91 * auVar9._0_4_;
  auVar95._4_4_ = fVar61 * auVar9._4_4_;
  auVar95._8_4_ = fVar144 * auVar9._8_4_;
  auVar95._12_4_ = fVar216 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar239,auVar239,0x55);
  auVar133 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar2,auVar9);
  local_4a8._0_4_ = (fVar60 + auVar146._0_4_) * 0.33333334 + (float)local_468._0_4_;
  local_4a8._4_4_ = (fVar175 + auVar146._4_4_) * 0.33333334 + (float)local_468._4_4_;
  fStack_4a0 = (fVar189 + auVar146._8_4_) * 0.33333334 + fStack_460;
  fStack_49c = (fVar190 + auVar146._12_4_) * 0.33333334 + fStack_45c;
  auVar65 = vsubps_avx(_local_4a8,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar65,auVar65,0xaa);
  auVar218._0_4_ = fVar91 * auVar9._0_4_;
  auVar218._4_4_ = fVar61 * auVar9._4_4_;
  auVar218._8_4_ = fVar144 * auVar9._8_4_;
  auVar218._12_4_ = fVar216 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar65,auVar65,0x55);
  auVar62 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar2,auVar9);
  auVar228._0_4_ = (fVar59 + auVar68._0_4_) * 0.33333334;
  auVar228._4_4_ = (fVar89 + auVar68._4_4_) * 0.33333334;
  auVar228._8_4_ = (fVar119 + auVar68._8_4_) * 0.33333334;
  auVar228._12_4_ = (fVar90 + auVar68._12_4_) * 0.33333334;
  auVar42._4_4_ = fStack_4c4;
  auVar42._0_4_ = local_4c8;
  auVar42._8_4_ = fStack_4c0;
  auVar42._12_4_ = fStack_4bc;
  _local_4b8 = vsubps_avx(auVar42,auVar228);
  auVar64 = vsubps_avx(_local_4b8,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar64,auVar64,0xaa);
  auVar229._0_4_ = fVar91 * auVar9._0_4_;
  auVar229._4_4_ = fVar61 * auVar9._4_4_;
  auVar229._8_4_ = fVar144 * auVar9._8_4_;
  auVar229._12_4_ = fVar216 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar64,auVar64,0x55);
  auVar93 = vfmadd231ps_fma(auVar229,(undefined1  [16])aVar2,auVar9);
  auVar230 = vsubps_avx(auVar42,(undefined1  [16])aVar1);
  auVar9 = vshufps_avx(auVar230,auVar230,0xaa);
  auVar180._0_4_ = fVar91 * auVar9._0_4_;
  auVar180._4_4_ = fVar61 * auVar9._4_4_;
  auVar180._8_4_ = fVar144 * auVar9._8_4_;
  auVar180._12_4_ = fVar216 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar230,auVar230,0x55);
  auVar9 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar2,auVar9);
  local_528._0_4_ = auVar127._0_4_;
  auVar164._4_4_ = local_528._0_4_;
  auVar164._0_4_ = local_528._0_4_;
  auVar164._8_4_ = local_528._0_4_;
  auVar164._12_4_ = local_528._0_4_;
  aVar2 = (pre->ray_space).vx.field_0;
  auVar108 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar2,auVar164);
  local_4e8._0_4_ = auVar10._0_4_;
  auVar165._4_4_ = local_4e8._0_4_;
  auVar165._0_4_ = local_4e8._0_4_;
  auVar165._8_4_ = local_4e8._0_4_;
  auVar165._12_4_ = local_4e8._0_4_;
  auVar10 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar2,auVar165);
  uVar57 = auVar12._0_4_;
  auVar166._4_4_ = uVar57;
  auVar166._0_4_ = uVar57;
  auVar166._8_4_ = uVar57;
  auVar166._12_4_ = uVar57;
  auVar63 = vfmadd231ps_fma(auVar124,(undefined1  [16])aVar2,auVar166);
  uVar57 = auVar11._0_4_;
  auVar167._4_4_ = uVar57;
  auVar167._0_4_ = uVar57;
  auVar167._8_4_ = uVar57;
  auVar167._12_4_ = uVar57;
  auVar11 = vfmadd231ps_fma(auVar120,(undefined1  [16])aVar2,auVar167);
  uVar57 = auVar239._0_4_;
  auVar168._4_4_ = uVar57;
  auVar168._0_4_ = uVar57;
  auVar168._8_4_ = uVar57;
  auVar168._12_4_ = uVar57;
  auVar239 = vfmadd231ps_fma(auVar133,(undefined1  [16])aVar2,auVar168);
  uVar57 = auVar65._0_4_;
  auVar169._4_4_ = uVar57;
  auVar169._0_4_ = uVar57;
  auVar169._8_4_ = uVar57;
  auVar169._12_4_ = uVar57;
  auVar65 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar2,auVar169);
  uVar57 = auVar64._0_4_;
  auVar71._4_4_ = uVar57;
  auVar71._0_4_ = uVar57;
  auVar71._8_4_ = uVar57;
  auVar71._12_4_ = uVar57;
  auVar64 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar2,auVar71);
  uVar57 = auVar230._0_4_;
  auVar72._4_4_ = uVar57;
  auVar72._0_4_ = uVar57;
  auVar72._8_4_ = uVar57;
  auVar72._12_4_ = uVar57;
  auVar230 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar2,auVar72);
  local_4e8 = vmovlhps_avx(auVar108,auVar239);
  local_4f8 = vmovlhps_avx(auVar10,auVar65);
  local_508 = vmovlhps_avx(auVar63,auVar64);
  _local_218 = vmovlhps_avx(auVar11,auVar230);
  auVar9 = vminps_avx(local_4e8,local_4f8);
  auVar12 = vminps_avx(local_508,_local_218);
  auVar127 = vminps_avx(auVar9,auVar12);
  auVar9 = vmaxps_avx(local_4e8,local_4f8);
  auVar12 = vmaxps_avx(local_508,_local_218);
  auVar9 = vmaxps_avx(auVar9,auVar12);
  auVar12 = vshufpd_avx(auVar127,auVar127,3);
  auVar127 = vminps_avx(auVar127,auVar12);
  auVar12 = vshufpd_avx(auVar9,auVar9,3);
  auVar12 = vmaxps_avx(auVar9,auVar12);
  auVar9 = vandps_avx(local_318,auVar127);
  auVar12 = vandps_avx(local_318,auVar12);
  auVar9 = vmaxps_avx(auVar9,auVar12);
  auVar12 = vmovshdup_avx(auVar9);
  auVar9 = vmaxss_avx(auVar12,auVar9);
  local_4d8 = uVar49 + 0xf;
  local_78 = auVar9._0_4_ * 9.536743e-07;
  local_3d8._0_8_ = auVar108._0_8_;
  local_3d8._8_8_ = local_3d8._0_8_;
  local_3e8._0_8_ = auVar10._0_8_;
  local_3e8._8_8_ = local_3e8._0_8_;
  local_3f8._8_8_ = auVar63._0_8_;
  local_3f8._0_8_ = auVar63._0_8_;
  local_408._8_8_ = auVar11._0_8_;
  local_408._0_8_ = auVar11._0_8_;
  register0x00001388 = auVar239._0_8_;
  local_418 = auVar239._0_8_;
  local_428 = auVar65._0_8_;
  register0x00001488 = local_428;
  local_438 = auVar64._0_8_;
  register0x000014c8 = local_438;
  register0x000012c8 = auVar230._0_8_;
  local_448 = auVar230._0_8_;
  local_228 = ZEXT416((uint)local_78);
  local_328 = 0x80000000;
  uStack_324 = 0x80000000;
  uStack_320 = 0x80000000;
  uStack_31c = 0x80000000;
  fStack_74 = local_78;
  fStack_70 = local_78;
  fStack_6c = local_78;
  fStack_68 = local_78;
  fStack_64 = local_78;
  fStack_60 = local_78;
  fStack_5c = local_78;
  fStack_90 = -local_78;
  local_98 = -local_78;
  fStack_94 = -local_78;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  bVar58 = false;
  uVar54 = 0;
  local_1e8 = vsubps_avx(local_4f8,local_4e8);
  local_1f8 = vsubps_avx(local_508,local_4f8);
  local_208 = vsubps_avx(_local_218,local_508);
  local_258 = vsubps_avx(_local_468,local_458);
  local_268 = vsubps_avx(_local_4a8,local_488);
  local_278 = vsubps_avx(_local_4b8,local_498);
  auVar43._4_4_ = fStack_4c4;
  auVar43._0_4_ = local_4c8;
  auVar43._8_4_ = fStack_4c0;
  auVar43._12_4_ = fStack_4bc;
  _local_288 = vsubps_avx(auVar43,local_478);
  auVar73 = ZEXT816(0x3f80000000000000);
  local_4d0 = prim;
  local_238 = auVar73;
LAB_011591ff:
  auVar9 = vshufps_avx(auVar73,auVar73,0x50);
  auVar260._8_4_ = 0x3f800000;
  auVar260._0_8_ = 0x3f8000003f800000;
  auVar260._12_4_ = 0x3f800000;
  auVar263._16_4_ = 0x3f800000;
  auVar263._0_16_ = auVar260;
  auVar263._20_4_ = 0x3f800000;
  auVar263._24_4_ = 0x3f800000;
  auVar263._28_4_ = 0x3f800000;
  auVar12 = vsubps_avx(auVar260,auVar9);
  fVar59 = auVar9._0_4_;
  auVar74._0_4_ = local_418._0_4_ * fVar59;
  fVar89 = auVar9._4_4_;
  auVar74._4_4_ = local_418._4_4_ * fVar89;
  fVar119 = auVar9._8_4_;
  auVar74._8_4_ = local_418._8_4_ * fVar119;
  fVar90 = auVar9._12_4_;
  auVar74._12_4_ = local_418._12_4_ * fVar90;
  auVar170._0_4_ = local_428._0_4_ * fVar59;
  auVar170._4_4_ = local_428._4_4_ * fVar89;
  auVar170._8_4_ = local_428._8_4_ * fVar119;
  auVar170._12_4_ = local_428._12_4_ * fVar90;
  auVar136._0_4_ = local_438._0_4_ * fVar59;
  auVar136._4_4_ = local_438._4_4_ * fVar89;
  auVar136._8_4_ = local_438._8_4_ * fVar119;
  auVar136._12_4_ = local_438._12_4_ * fVar90;
  auVar110._0_4_ = local_448._0_4_ * fVar59;
  auVar110._4_4_ = local_448._4_4_ * fVar89;
  auVar110._8_4_ = local_448._8_4_ * fVar119;
  auVar110._12_4_ = local_448._12_4_ * fVar90;
  auVar11 = vfmadd231ps_fma(auVar74,auVar12,local_3d8);
  auVar239 = vfmadd231ps_fma(auVar170,auVar12,local_3e8);
  auVar65 = vfmadd231ps_fma(auVar136,auVar12,local_3f8);
  auVar64 = vfmadd231ps_fma(auVar110,local_408,auVar12);
  auVar9 = vmovshdup_avx(local_238);
  fVar59 = local_238._0_4_;
  fStack_140 = (auVar9._0_4_ - fVar59) * 0.04761905;
  auVar214._4_4_ = fVar59;
  auVar214._0_4_ = fVar59;
  auVar214._8_4_ = fVar59;
  auVar214._12_4_ = fVar59;
  auVar214._16_4_ = fVar59;
  auVar214._20_4_ = fVar59;
  auVar214._24_4_ = fVar59;
  auVar214._28_4_ = fVar59;
  auVar105._0_8_ = auVar9._0_8_;
  auVar105._8_8_ = auVar105._0_8_;
  auVar105._16_8_ = auVar105._0_8_;
  auVar105._24_8_ = auVar105._0_8_;
  auVar86 = vsubps_avx(auVar105,auVar214);
  uVar57 = auVar11._0_4_;
  auVar258._4_4_ = uVar57;
  auVar258._0_4_ = uVar57;
  auVar258._8_4_ = uVar57;
  auVar258._12_4_ = uVar57;
  auVar258._16_4_ = uVar57;
  auVar258._20_4_ = uVar57;
  auVar258._24_4_ = uVar57;
  auVar258._28_4_ = uVar57;
  auVar9 = vmovshdup_avx(auVar11);
  uVar92 = auVar9._0_8_;
  auVar252._8_8_ = uVar92;
  auVar252._0_8_ = uVar92;
  auVar252._16_8_ = uVar92;
  auVar252._24_8_ = uVar92;
  fVar60 = auVar239._0_4_;
  auVar243._4_4_ = fVar60;
  auVar243._0_4_ = fVar60;
  auVar243._8_4_ = fVar60;
  auVar243._12_4_ = fVar60;
  auVar243._16_4_ = fVar60;
  auVar243._20_4_ = fVar60;
  auVar243._24_4_ = fVar60;
  auVar243._28_4_ = fVar60;
  auVar12 = vmovshdup_avx(auVar239);
  auVar106._0_8_ = auVar12._0_8_;
  auVar106._8_8_ = auVar106._0_8_;
  auVar106._16_8_ = auVar106._0_8_;
  auVar106._24_8_ = auVar106._0_8_;
  fVar216 = auVar65._0_4_;
  auVar186._4_4_ = fVar216;
  auVar186._0_4_ = fVar216;
  auVar186._8_4_ = fVar216;
  auVar186._12_4_ = fVar216;
  auVar186._16_4_ = fVar216;
  auVar186._20_4_ = fVar216;
  auVar186._24_4_ = fVar216;
  auVar186._28_4_ = fVar216;
  auVar127 = vmovshdup_avx(auVar65);
  auVar199._0_8_ = auVar127._0_8_;
  auVar199._8_8_ = auVar199._0_8_;
  auVar199._16_8_ = auVar199._0_8_;
  auVar199._24_8_ = auVar199._0_8_;
  fVar144 = auVar64._0_4_;
  auVar10 = vmovshdup_avx(auVar64);
  auVar230 = vfmadd132ps_fma(auVar86,auVar214,_DAT_01f7b040);
  auVar86 = vsubps_avx(auVar263,ZEXT1632(auVar230));
  fVar59 = auVar230._0_4_;
  fVar89 = auVar230._4_4_;
  auVar13._4_4_ = fVar60 * fVar89;
  auVar13._0_4_ = fVar60 * fVar59;
  fVar119 = auVar230._8_4_;
  auVar13._8_4_ = fVar60 * fVar119;
  fVar90 = auVar230._12_4_;
  auVar13._12_4_ = fVar60 * fVar90;
  auVar13._16_4_ = fVar60 * 0.0;
  auVar13._20_4_ = fVar60 * 0.0;
  auVar13._24_4_ = fVar60 * 0.0;
  auVar13._28_4_ = 0x3f800000;
  auVar230 = vfmadd231ps_fma(auVar13,auVar86,auVar258);
  fVar91 = auVar12._0_4_;
  fVar61 = auVar12._4_4_;
  auVar14._4_4_ = fVar61 * fVar89;
  auVar14._0_4_ = fVar91 * fVar59;
  auVar14._8_4_ = fVar91 * fVar119;
  auVar14._12_4_ = fVar61 * fVar90;
  auVar14._16_4_ = fVar91 * 0.0;
  auVar14._20_4_ = fVar61 * 0.0;
  auVar14._24_4_ = fVar91 * 0.0;
  auVar14._28_4_ = uVar57;
  auVar108 = vfmadd231ps_fma(auVar14,auVar86,auVar252);
  auVar15._4_4_ = fVar216 * fVar89;
  auVar15._0_4_ = fVar216 * fVar59;
  auVar15._8_4_ = fVar216 * fVar119;
  auVar15._12_4_ = fVar216 * fVar90;
  auVar15._16_4_ = fVar216 * 0.0;
  auVar15._20_4_ = fVar216 * 0.0;
  auVar15._24_4_ = fVar216 * 0.0;
  auVar15._28_4_ = auVar9._4_4_;
  auVar63 = vfmadd231ps_fma(auVar15,auVar86,auVar243);
  fVar91 = auVar127._0_4_;
  fVar61 = auVar127._4_4_;
  auVar8._4_4_ = fVar61 * fVar89;
  auVar8._0_4_ = fVar91 * fVar59;
  auVar8._8_4_ = fVar91 * fVar119;
  auVar8._12_4_ = fVar61 * fVar90;
  auVar8._16_4_ = fVar91 * 0.0;
  auVar8._20_4_ = fVar61 * 0.0;
  auVar8._24_4_ = fVar91 * 0.0;
  auVar8._28_4_ = fVar60;
  auVar124 = vfmadd231ps_fma(auVar8,auVar86,auVar106);
  auVar9 = vshufps_avx(auVar11,auVar11,0xaa);
  local_3c8._8_8_ = auVar9._0_8_;
  local_3c8._0_8_ = local_3c8._8_8_;
  local_3c8._16_8_ = local_3c8._8_8_;
  local_3c8._24_8_ = local_3c8._8_8_;
  auVar12 = vshufps_avx(auVar11,auVar11,0xff);
  uStack_520 = auVar12._0_8_;
  local_528 = (undefined1  [8])uStack_520;
  uStack_518 = uStack_520;
  uStack_510 = uStack_520;
  auVar245._4_4_ = fVar144 * fVar89;
  auVar245._0_4_ = fVar144 * fVar59;
  auVar245._8_4_ = fVar144 * fVar119;
  auVar245._12_4_ = fVar144 * fVar90;
  auVar245._16_4_ = fVar144 * 0.0;
  auVar245._20_4_ = fVar144 * 0.0;
  auVar245._24_4_ = fVar144 * 0.0;
  auVar245._28_4_ = fVar144;
  auVar11 = vfmadd231ps_fma(auVar245,auVar86,auVar186);
  auVar12 = vshufps_avx(auVar239,auVar239,0xaa);
  auVar187._0_8_ = auVar12._0_8_;
  auVar187._8_8_ = auVar187._0_8_;
  auVar187._16_8_ = auVar187._0_8_;
  auVar187._24_8_ = auVar187._0_8_;
  auVar127 = vshufps_avx(auVar239,auVar239,0xff);
  local_378._8_8_ = auVar127._0_8_;
  local_378._0_8_ = local_378._8_8_;
  local_378._16_8_ = local_378._8_8_;
  local_378._24_8_ = local_378._8_8_;
  fVar91 = auVar10._0_4_;
  fVar61 = auVar10._4_4_;
  auVar17._4_4_ = fVar61 * fVar89;
  auVar17._0_4_ = fVar91 * fVar59;
  auVar17._8_4_ = fVar91 * fVar119;
  auVar17._12_4_ = fVar61 * fVar90;
  auVar17._16_4_ = fVar91 * 0.0;
  auVar17._20_4_ = fVar61 * 0.0;
  auVar17._24_4_ = fVar91 * 0.0;
  auVar17._28_4_ = auVar9._4_4_;
  auVar120 = vfmadd231ps_fma(auVar17,auVar86,auVar199);
  auVar18._28_4_ = fVar61;
  auVar18._0_28_ =
       ZEXT1628(CONCAT412(auVar63._12_4_ * fVar90,
                          CONCAT48(auVar63._8_4_ * fVar119,
                                   CONCAT44(auVar63._4_4_ * fVar89,auVar63._0_4_ * fVar59))));
  auVar230 = vfmadd231ps_fma(auVar18,auVar86,ZEXT1632(auVar230));
  fVar91 = auVar127._4_4_;
  auVar19._28_4_ = fVar91;
  auVar19._0_28_ =
       ZEXT1628(CONCAT412(auVar124._12_4_ * fVar90,
                          CONCAT48(auVar124._8_4_ * fVar119,
                                   CONCAT44(auVar124._4_4_ * fVar89,auVar124._0_4_ * fVar59))));
  auVar108 = vfmadd231ps_fma(auVar19,auVar86,ZEXT1632(auVar108));
  auVar9 = vshufps_avx(auVar65,auVar65,0xaa);
  uVar92 = auVar9._0_8_;
  auVar174._8_8_ = uVar92;
  auVar174._0_8_ = uVar92;
  auVar174._16_8_ = uVar92;
  auVar174._24_8_ = uVar92;
  auVar10 = vshufps_avx(auVar65,auVar65,0xff);
  uVar92 = auVar10._0_8_;
  auVar264._8_8_ = uVar92;
  auVar264._0_8_ = uVar92;
  auVar264._16_8_ = uVar92;
  auVar264._24_8_ = uVar92;
  auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar11._12_4_ * fVar90,
                                               CONCAT48(auVar11._8_4_ * fVar119,
                                                        CONCAT44(auVar11._4_4_ * fVar89,
                                                                 auVar11._0_4_ * fVar59)))),auVar86,
                            ZEXT1632(auVar63));
  auVar11 = vshufps_avx(auVar64,auVar64,0xaa);
  auVar239 = vshufps_avx(auVar64,auVar64,0xff);
  auVar64 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar90 * auVar120._12_4_,
                                               CONCAT48(fVar119 * auVar120._8_4_,
                                                        CONCAT44(fVar89 * auVar120._4_4_,
                                                                 fVar59 * auVar120._0_4_)))),auVar86
                            ,ZEXT1632(auVar124));
  auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar90 * auVar65._12_4_,
                                               CONCAT48(fVar119 * auVar65._8_4_,
                                                        CONCAT44(fVar89 * auVar65._4_4_,
                                                                 fVar59 * auVar65._0_4_)))),auVar86,
                            ZEXT1632(auVar230));
  auVar13 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar230));
  auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar90 * auVar64._12_4_,
                                               CONCAT48(fVar119 * auVar64._8_4_,
                                                        CONCAT44(fVar89 * auVar64._4_4_,
                                                                 fVar59 * auVar64._0_4_)))),auVar86,
                            ZEXT1632(auVar108));
  auVar14 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar108));
  fVar61 = auVar14._28_4_;
  auVar244._0_4_ = fStack_140 * auVar13._0_4_ * 3.0;
  auVar244._4_4_ = fStack_140 * auVar13._4_4_ * 3.0;
  auVar244._8_4_ = fStack_140 * auVar13._8_4_ * 3.0;
  auVar244._12_4_ = fStack_140 * auVar13._12_4_ * 3.0;
  auVar244._16_4_ = fStack_140 * auVar13._16_4_ * 3.0;
  auVar244._20_4_ = fStack_140 * auVar13._20_4_ * 3.0;
  auVar244._24_4_ = fStack_140 * auVar13._24_4_ * 3.0;
  auVar244._28_4_ = 0;
  local_308._0_4_ = fStack_140 * auVar14._0_4_ * 3.0;
  local_308._4_4_ = fStack_140 * auVar14._4_4_ * 3.0;
  fStack_300 = fStack_140 * auVar14._8_4_ * 3.0;
  fStack_2fc = fStack_140 * auVar14._12_4_ * 3.0;
  fStack_2f8 = fStack_140 * auVar14._16_4_ * 3.0;
  fStack_2f4 = fStack_140 * auVar14._20_4_ * 3.0;
  fStack_2f0 = fStack_140 * auVar14._24_4_ * 3.0;
  fStack_2ec = fVar61;
  fVar144 = auVar12._0_4_;
  fVar216 = auVar12._4_4_;
  auVar20._4_4_ = fVar216 * fVar89;
  auVar20._0_4_ = fVar144 * fVar59;
  auVar20._8_4_ = fVar144 * fVar119;
  auVar20._12_4_ = fVar216 * fVar90;
  auVar20._16_4_ = fVar144 * 0.0;
  auVar20._20_4_ = fVar216 * 0.0;
  auVar20._24_4_ = fVar144 * 0.0;
  auVar20._28_4_ = fVar61;
  auVar12 = vfmadd231ps_fma(auVar20,auVar86,local_3c8);
  fVar144 = auVar127._0_4_;
  auVar21._4_4_ = fVar91 * fVar89;
  auVar21._0_4_ = fVar144 * fVar59;
  auVar21._8_4_ = fVar144 * fVar119;
  auVar21._12_4_ = fVar91 * fVar90;
  auVar21._16_4_ = fVar144 * 0.0;
  auVar21._20_4_ = fVar91 * 0.0;
  auVar21._24_4_ = fVar144 * 0.0;
  auVar21._28_4_ = 0;
  auVar127 = vfmadd231ps_fma(auVar21,auVar86,_local_528);
  fVar91 = auVar9._0_4_;
  fVar144 = auVar9._4_4_;
  auVar22._4_4_ = fVar144 * fVar89;
  auVar22._0_4_ = fVar91 * fVar59;
  auVar22._8_4_ = fVar91 * fVar119;
  auVar22._12_4_ = fVar144 * fVar90;
  auVar22._16_4_ = fVar91 * 0.0;
  auVar22._20_4_ = fVar144 * 0.0;
  auVar22._24_4_ = fVar91 * 0.0;
  auVar22._28_4_ = auVar13._28_4_;
  auVar9 = vfmadd231ps_fma(auVar22,auVar86,auVar187);
  fVar91 = auVar10._0_4_;
  fVar60 = auVar10._4_4_;
  auVar23._4_4_ = fVar60 * fVar89;
  auVar23._0_4_ = fVar91 * fVar59;
  auVar23._8_4_ = fVar91 * fVar119;
  auVar23._12_4_ = fVar60 * fVar90;
  auVar23._16_4_ = fVar91 * 0.0;
  auVar23._20_4_ = fVar60 * 0.0;
  auVar23._24_4_ = fVar91 * 0.0;
  auVar23._28_4_ = fVar216;
  auVar10 = vfmadd231ps_fma(auVar23,auVar86,local_378);
  local_378 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar63));
  fVar91 = auVar11._0_4_;
  fVar144 = auVar11._4_4_;
  auVar24._4_4_ = fVar144 * fVar89;
  auVar24._0_4_ = fVar91 * fVar59;
  auVar24._8_4_ = fVar91 * fVar119;
  auVar24._12_4_ = fVar144 * fVar90;
  auVar24._16_4_ = fVar91 * 0.0;
  auVar24._20_4_ = fVar144 * 0.0;
  auVar24._24_4_ = fVar91 * 0.0;
  auVar24._28_4_ = fVar144;
  auVar11 = vfmadd231ps_fma(auVar24,auVar86,auVar174);
  _local_528 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar65));
  fVar91 = auVar239._0_4_;
  fVar144 = auVar239._4_4_;
  auVar25._4_4_ = fVar144 * fVar89;
  auVar25._0_4_ = fVar91 * fVar59;
  auVar25._8_4_ = fVar91 * fVar119;
  auVar25._12_4_ = fVar144 * fVar90;
  auVar25._16_4_ = fVar91 * 0.0;
  auVar25._20_4_ = fVar144 * 0.0;
  auVar25._24_4_ = fVar91 * 0.0;
  auVar25._28_4_ = fVar144;
  auVar239 = vfmadd231ps_fma(auVar25,auVar86,auVar264);
  auVar26._28_4_ = fVar60;
  auVar26._0_28_ =
       ZEXT1628(CONCAT412(auVar9._12_4_ * fVar90,
                          CONCAT48(auVar9._8_4_ * fVar119,
                                   CONCAT44(auVar9._4_4_ * fVar89,auVar9._0_4_ * fVar59))));
  auVar12 = vfmadd231ps_fma(auVar26,auVar86,ZEXT1632(auVar12));
  auVar127 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar90 * auVar10._12_4_,
                                                CONCAT48(fVar119 * auVar10._8_4_,
                                                         CONCAT44(fVar89 * auVar10._4_4_,
                                                                  fVar59 * auVar10._0_4_)))),auVar86
                             ,ZEXT1632(auVar127));
  local_3c8._0_4_ = auVar63._0_4_ + auVar244._0_4_;
  local_3c8._4_4_ = auVar63._4_4_ + auVar244._4_4_;
  local_3c8._8_4_ = auVar63._8_4_ + auVar244._8_4_;
  local_3c8._12_4_ = auVar63._12_4_ + auVar244._12_4_;
  local_3c8._16_4_ = auVar244._16_4_ + 0.0;
  local_3c8._20_4_ = auVar244._20_4_ + 0.0;
  local_3c8._24_4_ = auVar244._24_4_ + 0.0;
  local_3c8._28_4_ = 0;
  auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar11._12_4_ * fVar90,
                                              CONCAT48(auVar11._8_4_ * fVar119,
                                                       CONCAT44(auVar11._4_4_ * fVar89,
                                                                auVar11._0_4_ * fVar59)))),auVar86,
                           ZEXT1632(auVar9));
  auVar10 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar239._12_4_ * fVar90,
                                               CONCAT48(auVar239._8_4_ * fVar119,
                                                        CONCAT44(auVar239._4_4_ * fVar89,
                                                                 auVar239._0_4_ * fVar59)))),auVar86
                            ,ZEXT1632(auVar10));
  auVar11 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar90 * auVar9._12_4_,
                                               CONCAT48(fVar119 * auVar9._8_4_,
                                                        CONCAT44(fVar89 * auVar9._4_4_,
                                                                 fVar59 * auVar9._0_4_)))),auVar86,
                            ZEXT1632(auVar12));
  auVar239 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar10._12_4_ * fVar90,
                                                CONCAT48(auVar10._8_4_ * fVar119,
                                                         CONCAT44(auVar10._4_4_ * fVar89,
                                                                  auVar10._0_4_ * fVar59)))),
                             ZEXT1632(auVar127),auVar86);
  auVar86 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar12));
  auVar13 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar127));
  auVar259._0_4_ = fStack_140 * auVar86._0_4_ * 3.0;
  auVar259._4_4_ = fStack_140 * auVar86._4_4_ * 3.0;
  auVar259._8_4_ = fStack_140 * auVar86._8_4_ * 3.0;
  auVar259._12_4_ = fStack_140 * auVar86._12_4_ * 3.0;
  auVar259._16_4_ = fStack_140 * auVar86._16_4_ * 3.0;
  auVar259._20_4_ = fStack_140 * auVar86._20_4_ * 3.0;
  auVar259._24_4_ = fStack_140 * auVar86._24_4_ * 3.0;
  auVar259._28_4_ = 0;
  local_158 = fStack_140 * auVar13._0_4_ * 3.0;
  fStack_154 = fStack_140 * auVar13._4_4_ * 3.0;
  auVar27._4_4_ = fStack_154;
  auVar27._0_4_ = local_158;
  fStack_150 = fStack_140 * auVar13._8_4_ * 3.0;
  auVar27._8_4_ = fStack_150;
  fStack_14c = fStack_140 * auVar13._12_4_ * 3.0;
  auVar27._12_4_ = fStack_14c;
  fStack_148 = fStack_140 * auVar13._16_4_ * 3.0;
  auVar27._16_4_ = fStack_148;
  fStack_144 = fStack_140 * auVar13._20_4_ * 3.0;
  auVar27._20_4_ = fStack_144;
  fStack_140 = fStack_140 * auVar13._24_4_ * 3.0;
  auVar27._24_4_ = fStack_140;
  auVar27._28_4_ = 0x40400000;
  _local_398 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar11));
  local_2a8 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar239));
  auVar86 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar63));
  auVar13 = vsubps_avx(ZEXT1632(auVar239),ZEXT1632(auVar65));
  auVar14 = vsubps_avx(_local_398,local_378);
  fVar175 = auVar86._0_4_ + auVar14._0_4_;
  fVar189 = auVar86._4_4_ + auVar14._4_4_;
  fVar190 = auVar86._8_4_ + auVar14._8_4_;
  fVar143 = auVar86._12_4_ + auVar14._12_4_;
  fVar156 = auVar86._16_4_ + auVar14._16_4_;
  fVar157 = auVar86._20_4_ + auVar14._20_4_;
  fVar158 = auVar86._24_4_ + auVar14._24_4_;
  auVar15 = vsubps_avx(local_2a8,_local_528);
  auVar87._0_4_ = auVar13._0_4_ + auVar15._0_4_;
  auVar87._4_4_ = auVar13._4_4_ + auVar15._4_4_;
  auVar87._8_4_ = auVar13._8_4_ + auVar15._8_4_;
  auVar87._12_4_ = auVar13._12_4_ + auVar15._12_4_;
  auVar87._16_4_ = auVar13._16_4_ + auVar15._16_4_;
  auVar87._20_4_ = auVar13._20_4_ + auVar15._20_4_;
  auVar87._24_4_ = auVar13._24_4_ + auVar15._24_4_;
  auVar87._28_4_ = auVar13._28_4_ + auVar15._28_4_;
  local_f8 = ZEXT1632(auVar65);
  fVar59 = auVar65._0_4_;
  local_178 = (float)local_308._0_4_ + fVar59;
  fVar89 = auVar65._4_4_;
  fStack_174 = (float)local_308._4_4_ + fVar89;
  fVar119 = auVar65._8_4_;
  fStack_170 = fStack_300 + fVar119;
  fVar90 = auVar65._12_4_;
  fStack_16c = fStack_2fc + fVar90;
  fStack_168 = fStack_2f8 + 0.0;
  fStack_164 = fStack_2f4 + 0.0;
  fStack_160 = fStack_2f0 + 0.0;
  local_b8 = ZEXT1632(auVar63);
  auVar13 = vsubps_avx(local_b8,auVar244);
  local_d8 = vpermps_avx2(_DAT_01fb7720,auVar13);
  auVar13 = vsubps_avx(local_f8,_local_308);
  local_198 = vpermps_avx2(_DAT_01fb7720,auVar13);
  local_118._0_4_ = auVar11._0_4_ + auVar259._0_4_;
  local_118._4_4_ = auVar11._4_4_ + auVar259._4_4_;
  local_118._8_4_ = auVar11._8_4_ + auVar259._8_4_;
  local_118._12_4_ = auVar11._12_4_ + auVar259._12_4_;
  local_118._16_4_ = auVar259._16_4_ + 0.0;
  local_118._20_4_ = auVar259._20_4_ + 0.0;
  local_118._24_4_ = auVar259._24_4_ + 0.0;
  local_118._28_4_ = 0;
  auVar245 = ZEXT1632(auVar11);
  auVar13 = vsubps_avx(auVar245,auVar259);
  _local_308 = vpermps_avx2(_DAT_01fb7720,auVar13);
  fVar91 = auVar239._0_4_;
  local_158 = fVar91 + local_158;
  fVar144 = auVar239._4_4_;
  fStack_154 = fVar144 + fStack_154;
  fVar216 = auVar239._8_4_;
  fStack_150 = fVar216 + fStack_150;
  fVar60 = auVar239._12_4_;
  fStack_14c = fVar60 + fStack_14c;
  fStack_148 = fStack_148 + 0.0;
  fStack_144 = fStack_144 + 0.0;
  fStack_140 = fStack_140 + 0.0;
  auVar13 = vsubps_avx(ZEXT1632(auVar239),auVar27);
  local_138 = vpermps_avx2(_DAT_01fb7720,auVar13);
  auVar28._4_4_ = fVar89 * fVar189;
  auVar28._0_4_ = fVar59 * fVar175;
  auVar28._8_4_ = fVar119 * fVar190;
  auVar28._12_4_ = fVar90 * fVar143;
  auVar28._16_4_ = fVar156 * 0.0;
  auVar28._20_4_ = fVar157 * 0.0;
  auVar28._24_4_ = fVar158 * 0.0;
  auVar28._28_4_ = auVar13._28_4_;
  auVar9 = vfnmadd231ps_fma(auVar28,local_b8,auVar87);
  fStack_15c = fVar61 + 0.0;
  auVar29._4_4_ = fStack_174 * fVar189;
  auVar29._0_4_ = local_178 * fVar175;
  auVar29._8_4_ = fStack_170 * fVar190;
  auVar29._12_4_ = fStack_16c * fVar143;
  auVar29._16_4_ = fStack_168 * fVar156;
  auVar29._20_4_ = fStack_164 * fVar157;
  auVar29._24_4_ = fStack_160 * fVar158;
  auVar29._28_4_ = 0;
  auVar12 = vfnmadd231ps_fma(auVar29,auVar87,local_3c8);
  auVar30._4_4_ = local_198._4_4_ * fVar189;
  auVar30._0_4_ = local_198._0_4_ * fVar175;
  auVar30._8_4_ = local_198._8_4_ * fVar190;
  auVar30._12_4_ = local_198._12_4_ * fVar143;
  auVar30._16_4_ = local_198._16_4_ * fVar156;
  auVar30._20_4_ = local_198._20_4_ * fVar157;
  auVar30._24_4_ = local_198._24_4_ * fVar158;
  auVar30._28_4_ = fVar61 + 0.0;
  auVar127 = vfnmadd231ps_fma(auVar30,local_d8,auVar87);
  auVar31._4_4_ = (float)local_528._4_4_ * fVar189;
  auVar31._0_4_ = (float)local_528._0_4_ * fVar175;
  auVar31._8_4_ = (float)uStack_520 * fVar190;
  auVar31._12_4_ = uStack_520._4_4_ * fVar143;
  auVar31._16_4_ = (float)uStack_518 * fVar156;
  auVar31._20_4_ = uStack_518._4_4_ * fVar157;
  auVar31._24_4_ = (float)uStack_510 * fVar158;
  auVar31._28_4_ = uStack_510._4_4_;
  auVar10 = vfnmadd231ps_fma(auVar31,local_378,auVar87);
  auVar200._0_4_ = fVar91 * fVar175;
  auVar200._4_4_ = fVar144 * fVar189;
  auVar200._8_4_ = fVar216 * fVar190;
  auVar200._12_4_ = fVar60 * fVar143;
  auVar200._16_4_ = fVar156 * 0.0;
  auVar200._20_4_ = fVar157 * 0.0;
  auVar200._24_4_ = fVar158 * 0.0;
  auVar200._28_4_ = 0;
  auVar11 = vfnmadd231ps_fma(auVar200,auVar245,auVar87);
  uStack_13c = 0x40400000;
  auVar32._4_4_ = fStack_154 * fVar189;
  auVar32._0_4_ = local_158 * fVar175;
  auVar32._8_4_ = fStack_150 * fVar190;
  auVar32._12_4_ = fStack_14c * fVar143;
  auVar32._16_4_ = fStack_148 * fVar156;
  auVar32._20_4_ = fStack_144 * fVar157;
  auVar32._24_4_ = fStack_140 * fVar158;
  auVar32._28_4_ = local_378._28_4_;
  auVar65 = vfnmadd231ps_fma(auVar32,local_118,auVar87);
  auVar33._4_4_ = local_138._4_4_ * fVar189;
  auVar33._0_4_ = local_138._0_4_ * fVar175;
  auVar33._8_4_ = local_138._8_4_ * fVar190;
  auVar33._12_4_ = local_138._12_4_ * fVar143;
  auVar33._16_4_ = local_138._16_4_ * fVar156;
  auVar33._20_4_ = local_138._20_4_ * fVar157;
  auVar33._24_4_ = local_138._24_4_ * fVar158;
  auVar33._28_4_ = local_138._28_4_;
  auVar64 = vfnmadd231ps_fma(auVar33,_local_308,auVar87);
  auVar34._4_4_ = local_2a8._4_4_ * fVar189;
  auVar34._0_4_ = local_2a8._0_4_ * fVar175;
  auVar34._8_4_ = local_2a8._8_4_ * fVar190;
  auVar34._12_4_ = local_2a8._12_4_ * fVar143;
  auVar34._16_4_ = local_2a8._16_4_ * fVar156;
  auVar34._20_4_ = local_2a8._20_4_ * fVar157;
  auVar34._24_4_ = local_2a8._24_4_ * fVar158;
  auVar34._28_4_ = auVar86._28_4_ + auVar14._28_4_;
  auVar215 = ZEXT3264(_local_398);
  auVar230 = vfnmadd231ps_fma(auVar34,_local_398,auVar87);
  auVar13 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar12));
  auVar86 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar12));
  auVar14 = vminps_avx(ZEXT1632(auVar127),ZEXT1632(auVar10));
  auVar14 = vminps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(ZEXT1632(auVar127),ZEXT1632(auVar10));
  auVar86 = vmaxps_avx(auVar86,auVar13);
  auVar15 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar65));
  auVar13 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar65));
  auVar8 = vminps_avx(ZEXT1632(auVar64),ZEXT1632(auVar230));
  auVar15 = vminps_avx(auVar15,auVar8);
  auVar15 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(ZEXT1632(auVar64),ZEXT1632(auVar230));
  auVar13 = vmaxps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(auVar86,auVar13);
  auVar46._4_4_ = fStack_74;
  auVar46._0_4_ = local_78;
  auVar46._8_4_ = fStack_70;
  auVar46._12_4_ = fStack_6c;
  auVar46._16_4_ = fStack_68;
  auVar46._20_4_ = fStack_64;
  auVar46._24_4_ = fStack_60;
  auVar46._28_4_ = fStack_5c;
  auVar86 = vcmpps_avx(auVar15,auVar46,2);
  auVar45._4_4_ = fStack_94;
  auVar45._0_4_ = local_98;
  auVar45._8_4_ = fStack_90;
  auVar45._12_4_ = fStack_8c;
  auVar45._16_4_ = fStack_88;
  auVar45._20_4_ = fStack_84;
  auVar45._24_4_ = fStack_80;
  auVar45._28_4_ = fStack_7c;
  auVar13 = vcmpps_avx(auVar13,auVar45,5);
  auVar86 = vandps_avx(auVar13,auVar86);
  auVar13 = local_1b8 & auVar86;
  if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0x7f,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar13 >> 0xbf,0) != '\0') ||
      (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0') {
    auVar13 = vsubps_avx(local_378,local_b8);
    auVar14 = vsubps_avx(_local_398,auVar245);
    fVar175 = auVar13._0_4_ + auVar14._0_4_;
    fVar189 = auVar13._4_4_ + auVar14._4_4_;
    fVar190 = auVar13._8_4_ + auVar14._8_4_;
    fVar143 = auVar13._12_4_ + auVar14._12_4_;
    fVar156 = auVar13._16_4_ + auVar14._16_4_;
    fVar157 = auVar13._20_4_ + auVar14._20_4_;
    fVar158 = auVar13._24_4_ + auVar14._24_4_;
    auVar15 = vsubps_avx(_local_528,local_f8);
    auVar8 = vsubps_avx(local_2a8,ZEXT1632(auVar239));
    auVar107._0_4_ = auVar15._0_4_ + auVar8._0_4_;
    auVar107._4_4_ = auVar15._4_4_ + auVar8._4_4_;
    auVar107._8_4_ = auVar15._8_4_ + auVar8._8_4_;
    auVar107._12_4_ = auVar15._12_4_ + auVar8._12_4_;
    auVar107._16_4_ = auVar15._16_4_ + auVar8._16_4_;
    auVar107._20_4_ = auVar15._20_4_ + auVar8._20_4_;
    auVar107._24_4_ = auVar15._24_4_ + auVar8._24_4_;
    fVar61 = auVar8._28_4_;
    auVar107._28_4_ = auVar15._28_4_ + fVar61;
    auVar35._4_4_ = fVar89 * fVar189;
    auVar35._0_4_ = fVar59 * fVar175;
    auVar35._8_4_ = fVar119 * fVar190;
    auVar35._12_4_ = fVar90 * fVar143;
    auVar35._16_4_ = fVar156 * 0.0;
    auVar35._20_4_ = fVar157 * 0.0;
    auVar35._24_4_ = fVar158 * 0.0;
    auVar35._28_4_ = local_2a8._28_4_;
    auVar11 = vfnmadd231ps_fma(auVar35,auVar107,local_b8);
    auVar36._4_4_ = fVar189 * fStack_174;
    auVar36._0_4_ = fVar175 * local_178;
    auVar36._8_4_ = fVar190 * fStack_170;
    auVar36._12_4_ = fVar143 * fStack_16c;
    auVar36._16_4_ = fVar156 * fStack_168;
    auVar36._20_4_ = fVar157 * fStack_164;
    auVar36._24_4_ = fVar158 * fStack_160;
    auVar36._28_4_ = 0;
    auVar9 = vfnmadd213ps_fma(local_3c8,auVar107,auVar36);
    auVar37._4_4_ = fVar189 * local_198._4_4_;
    auVar37._0_4_ = fVar175 * local_198._0_4_;
    auVar37._8_4_ = fVar190 * local_198._8_4_;
    auVar37._12_4_ = fVar143 * local_198._12_4_;
    auVar37._16_4_ = fVar156 * local_198._16_4_;
    auVar37._20_4_ = fVar157 * local_198._20_4_;
    auVar37._24_4_ = fVar158 * local_198._24_4_;
    auVar37._28_4_ = 0;
    auVar12 = vfnmadd213ps_fma(local_d8,auVar107,auVar37);
    auVar38._4_4_ = (float)local_528._4_4_ * fVar189;
    auVar38._0_4_ = (float)local_528._0_4_ * fVar175;
    auVar38._8_4_ = (float)uStack_520 * fVar190;
    auVar38._12_4_ = uStack_520._4_4_ * fVar143;
    auVar38._16_4_ = (float)uStack_518 * fVar156;
    auVar38._20_4_ = uStack_518._4_4_ * fVar157;
    auVar38._24_4_ = (float)uStack_510 * fVar158;
    auVar38._28_4_ = 0;
    auVar239 = vfnmadd231ps_fma(auVar38,auVar107,local_378);
    auVar131._0_4_ = fVar91 * fVar175;
    auVar131._4_4_ = fVar144 * fVar189;
    auVar131._8_4_ = fVar216 * fVar190;
    auVar131._12_4_ = fVar60 * fVar143;
    auVar131._16_4_ = fVar156 * 0.0;
    auVar131._20_4_ = fVar157 * 0.0;
    auVar131._24_4_ = fVar158 * 0.0;
    auVar131._28_4_ = 0;
    auVar65 = vfnmadd231ps_fma(auVar131,auVar107,auVar245);
    auVar39._4_4_ = fVar189 * fStack_154;
    auVar39._0_4_ = fVar175 * local_158;
    auVar39._8_4_ = fVar190 * fStack_150;
    auVar39._12_4_ = fVar143 * fStack_14c;
    auVar39._16_4_ = fVar156 * fStack_148;
    auVar39._20_4_ = fVar157 * fStack_144;
    auVar39._24_4_ = fVar158 * fStack_140;
    auVar39._28_4_ = fVar61;
    auVar127 = vfnmadd213ps_fma(local_118,auVar107,auVar39);
    auVar40._4_4_ = fVar189 * local_138._4_4_;
    auVar40._0_4_ = fVar175 * local_138._0_4_;
    auVar40._8_4_ = fVar190 * local_138._8_4_;
    auVar40._12_4_ = fVar143 * local_138._12_4_;
    auVar40._16_4_ = fVar156 * local_138._16_4_;
    auVar40._20_4_ = fVar157 * local_138._20_4_;
    auVar40._24_4_ = fVar158 * local_138._24_4_;
    auVar40._28_4_ = fVar61;
    auVar10 = vfnmadd213ps_fma(_local_308,auVar107,auVar40);
    auVar215 = ZEXT1664(auVar10);
    auVar41._4_4_ = fVar189 * local_2a8._4_4_;
    auVar41._0_4_ = fVar175 * local_2a8._0_4_;
    auVar41._8_4_ = fVar190 * local_2a8._8_4_;
    auVar41._12_4_ = fVar143 * local_2a8._12_4_;
    auVar41._16_4_ = fVar156 * local_2a8._16_4_;
    auVar41._20_4_ = fVar157 * local_2a8._20_4_;
    auVar41._24_4_ = fVar158 * local_2a8._24_4_;
    auVar41._28_4_ = auVar13._28_4_ + auVar14._28_4_;
    auVar64 = vfnmadd231ps_fma(auVar41,auVar107,_local_398);
    auVar14 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar9));
    auVar13 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar9));
    auVar15 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar239));
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar239));
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar8 = vminps_avx(ZEXT1632(auVar65),ZEXT1632(auVar127));
    auVar14 = vmaxps_avx(ZEXT1632(auVar65),ZEXT1632(auVar127));
    auVar245 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar64));
    auVar8 = vminps_avx(auVar8,auVar245);
    auVar8 = vminps_avx(auVar15,auVar8);
    auVar15 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar64));
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar13,auVar14);
    auVar13 = vcmpps_avx(auVar8,auVar46,2);
    auVar14 = vcmpps_avx(auVar14,auVar45,5);
    auVar13 = vandps_avx(auVar14,auVar13);
    auVar86 = vandps_avx(auVar86,local_1b8);
    auVar14 = auVar86 & auVar13;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar86 = vandps_avx(auVar13,auVar86);
      uVar56 = vmovmskps_avx(auVar86);
      if (uVar56 != 0) {
        auStack_2e8[uVar54] = uVar56 & 0xff;
        uVar92 = vmovlps_avx(local_238);
        *(undefined8 *)(&uStack_1d8 + uVar54 * 2) = uVar92;
        uVar55 = vmovlps_avx(auVar73);
        auStack_58[uVar54] = uVar55;
        uVar54 = (ulong)((int)uVar54 + 1);
      }
    }
  }
LAB_011597b0:
  local_358.valid = &local_53c;
  if ((int)uVar54 != 0) {
    uVar47 = (int)uVar54 - 1;
    uVar50 = (ulong)uVar47;
    uVar53 = auStack_2e8[uVar50];
    uVar56 = (&uStack_1d8)[uVar50 * 2];
    fVar59 = afStack_1d4[uVar50 * 2];
    iVar16 = 0;
    for (uVar55 = (ulong)uVar53; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
      iVar16 = iVar16 + 1;
    }
    uVar53 = uVar53 - 1 & uVar53;
    if (uVar53 == 0) {
      uVar54 = (ulong)uVar47;
    }
    auVar73._8_8_ = 0;
    auVar73._0_8_ = auStack_58[uVar50];
    auStack_2e8[uVar50] = uVar53;
    fVar89 = (float)(iVar16 + 1) * 0.14285715;
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * (float)iVar16 * 0.14285715)),ZEXT416(uVar56),
                             ZEXT416((uint)(1.0 - (float)iVar16 * 0.14285715)));
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * fVar89)),ZEXT416(uVar56),
                              ZEXT416((uint)(1.0 - fVar89)));
    fVar89 = auVar12._0_4_;
    auVar188._0_4_ = auVar9._0_4_;
    fVar59 = fVar89 - auVar188._0_4_;
    if (fVar59 < 0.16666667) {
      auVar127 = vshufps_avx(auVar73,auVar73,0x50);
      auVar96._8_4_ = 0x3f800000;
      auVar96._0_8_ = 0x3f8000003f800000;
      auVar96._12_4_ = 0x3f800000;
      auVar10 = vsubps_avx(auVar96,auVar127);
      fVar119 = auVar127._0_4_;
      auVar137._0_4_ = fVar119 * (float)local_418._0_4_;
      fVar90 = auVar127._4_4_;
      auVar137._4_4_ = fVar90 * (float)local_418._4_4_;
      fVar91 = auVar127._8_4_;
      auVar137._8_4_ = fVar91 * fStack_410;
      fVar61 = auVar127._12_4_;
      auVar137._12_4_ = fVar61 * fStack_40c;
      auVar147._0_4_ = fVar119 * (float)local_428._0_4_;
      auVar147._4_4_ = fVar90 * (float)local_428._4_4_;
      auVar147._8_4_ = fVar91 * fStack_420;
      auVar147._12_4_ = fVar61 * fStack_41c;
      auVar171._0_4_ = fVar119 * (float)local_438._0_4_;
      auVar171._4_4_ = fVar90 * (float)local_438._4_4_;
      auVar171._8_4_ = fVar91 * fStack_430;
      auVar171._12_4_ = fVar61 * fStack_42c;
      auVar75._0_4_ = fVar119 * (float)local_448._0_4_;
      auVar75._4_4_ = fVar90 * (float)local_448._4_4_;
      auVar75._8_4_ = fVar91 * fStack_440;
      auVar75._12_4_ = fVar61 * fStack_43c;
      auVar127 = vfmadd231ps_fma(auVar137,auVar10,local_3d8);
      auVar11 = vfmadd231ps_fma(auVar147,auVar10,local_3e8);
      auVar239 = vfmadd231ps_fma(auVar171,auVar10,local_3f8);
      auVar10 = vfmadd231ps_fma(auVar75,auVar10,local_408);
      auVar132._16_16_ = auVar127;
      auVar132._0_16_ = auVar127;
      auVar142._16_16_ = auVar11;
      auVar142._0_16_ = auVar11;
      auVar155._16_16_ = auVar239;
      auVar155._0_16_ = auVar239;
      _local_528 = auVar9;
      auVar188._4_4_ = auVar188._0_4_;
      auVar188._8_4_ = auVar188._0_4_;
      auVar188._12_4_ = auVar188._0_4_;
      local_3c8._0_16_ = auVar12;
      auVar188._20_4_ = fVar89;
      auVar188._16_4_ = fVar89;
      auVar188._24_4_ = fVar89;
      auVar188._28_4_ = fVar89;
      auVar86 = vsubps_avx(auVar142,auVar132);
      auVar11 = vfmadd213ps_fma(auVar86,auVar188,auVar132);
      auVar86 = vsubps_avx(auVar155,auVar142);
      auVar65 = vfmadd213ps_fma(auVar86,auVar188,auVar142);
      auVar127 = vsubps_avx(auVar10,auVar239);
      auVar88._16_16_ = auVar127;
      auVar88._0_16_ = auVar127;
      auVar127 = vfmadd213ps_fma(auVar88,auVar188,auVar155);
      auVar86 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar11));
      auVar10 = vfmadd213ps_fma(auVar86,auVar188,ZEXT1632(auVar11));
      auVar86 = vsubps_avx(ZEXT1632(auVar127),ZEXT1632(auVar65));
      auVar127 = vfmadd213ps_fma(auVar86,auVar188,ZEXT1632(auVar65));
      auVar86 = vsubps_avx(ZEXT1632(auVar127),ZEXT1632(auVar10));
      auVar108 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar86,auVar188);
      fVar216 = auVar86._4_4_ * 3.0;
      local_378._0_4_ = fVar59;
      fVar119 = fVar59 * 0.33333334;
      local_2a8._0_8_ =
           CONCAT44(auVar108._4_4_ + fVar119 * fVar216,
                    auVar108._0_4_ + fVar119 * auVar86._0_4_ * 3.0);
      local_2a8._8_4_ = auVar108._8_4_ + fVar119 * auVar86._8_4_ * 3.0;
      local_2a8._12_4_ = auVar108._12_4_ + fVar119 * auVar86._12_4_ * 3.0;
      auVar10 = vshufpd_avx(auVar108,auVar108,3);
      auVar11 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_398 = auVar10;
      auVar127 = vsubps_avx(auVar10,auVar108);
      auVar239 = vsubps_avx(auVar11,(undefined1  [16])0x0);
      auVar76._0_4_ = auVar127._0_4_ + auVar239._0_4_;
      auVar76._4_4_ = auVar127._4_4_ + auVar239._4_4_;
      auVar76._8_4_ = auVar127._8_4_ + auVar239._8_4_;
      auVar76._12_4_ = auVar127._12_4_ + auVar239._12_4_;
      auVar127 = vshufps_avx(auVar108,auVar108,0xb1);
      auVar239 = vshufps_avx(local_2a8._0_16_,local_2a8._0_16_,0xb1);
      auVar255._4_4_ = auVar76._0_4_;
      auVar255._0_4_ = auVar76._0_4_;
      auVar255._8_4_ = auVar76._0_4_;
      auVar255._12_4_ = auVar76._0_4_;
      auVar65 = vshufps_avx(auVar76,auVar76,0x55);
      fVar90 = auVar65._0_4_;
      auVar77._0_4_ = fVar90 * auVar127._0_4_;
      fVar91 = auVar65._4_4_;
      auVar77._4_4_ = fVar91 * auVar127._4_4_;
      fVar61 = auVar65._8_4_;
      auVar77._8_4_ = fVar61 * auVar127._8_4_;
      fVar144 = auVar65._12_4_;
      auVar77._12_4_ = fVar144 * auVar127._12_4_;
      auVar148._0_4_ = fVar90 * auVar239._0_4_;
      auVar148._4_4_ = fVar91 * auVar239._4_4_;
      auVar148._8_4_ = fVar61 * auVar239._8_4_;
      auVar148._12_4_ = fVar144 * auVar239._12_4_;
      auVar64 = vfmadd231ps_fma(auVar77,auVar255,auVar108);
      auVar230 = vfmadd231ps_fma(auVar148,auVar255,local_2a8._0_16_);
      auVar239 = vshufps_avx(auVar64,auVar64,0xe8);
      auVar65 = vshufps_avx(auVar230,auVar230,0xe8);
      auVar127 = vcmpps_avx(auVar239,auVar65,1);
      uVar56 = vextractps_avx(auVar127,0);
      auVar63 = auVar230;
      if ((uVar56 & 1) == 0) {
        auVar63 = auVar64;
      }
      auVar123._0_4_ = fVar119 * auVar86._16_4_ * 3.0;
      auVar123._4_4_ = fVar119 * fVar216;
      auVar123._8_4_ = fVar119 * auVar86._24_4_ * 3.0;
      auVar123._12_4_ = fVar119 * auVar215._28_4_;
      auVar62 = vsubps_avx((undefined1  [16])0x0,auVar123);
      auVar124 = vshufps_avx(auVar62,auVar62,0xb1);
      auVar120 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar181._0_4_ = fVar90 * auVar124._0_4_;
      auVar181._4_4_ = fVar91 * auVar124._4_4_;
      auVar181._8_4_ = fVar61 * auVar124._8_4_;
      auVar181._12_4_ = fVar144 * auVar124._12_4_;
      auVar196._0_4_ = auVar120._0_4_ * fVar90;
      auVar196._4_4_ = auVar120._4_4_ * fVar91;
      auVar196._8_4_ = auVar120._8_4_ * fVar61;
      auVar196._12_4_ = auVar120._12_4_ * fVar144;
      _local_308 = auVar62;
      auVar93 = vfmadd231ps_fma(auVar181,auVar255,auVar62);
      auVar145 = vfmadd231ps_fma(auVar196,(undefined1  [16])0x0,auVar255);
      auVar120 = vshufps_avx(auVar93,auVar93,0xe8);
      auVar133 = vshufps_avx(auVar145,auVar145,0xe8);
      auVar215 = ZEXT1664(auVar133);
      auVar124 = vcmpps_avx(auVar120,auVar133,1);
      uVar56 = vextractps_avx(auVar124,0);
      auVar159 = auVar145;
      if ((uVar56 & 1) == 0) {
        auVar159 = auVar93;
      }
      auVar63 = vmaxss_avx(auVar159,auVar63);
      auVar239 = vminps_avx(auVar239,auVar65);
      auVar65 = vminps_avx(auVar120,auVar133);
      auVar65 = vminps_avx(auVar239,auVar65);
      auVar127 = vshufps_avx(auVar127,auVar127,0x55);
      auVar127 = vblendps_avx(auVar127,auVar124,2);
      auVar124 = vpslld_avx(auVar127,0x1f);
      auVar127 = vshufpd_avx(auVar230,auVar230,1);
      auVar127 = vinsertps_avx(auVar127,auVar145,0x9c);
      auVar239 = vshufpd_avx(auVar64,auVar64,1);
      auVar239 = vinsertps_avx(auVar239,auVar93,0x9c);
      auVar127 = vblendvps_avx(auVar239,auVar127,auVar124);
      auVar239 = vmovshdup_avx(auVar127);
      auVar127 = vmaxss_avx(auVar239,auVar127);
      fVar61 = auVar65._0_4_;
      auVar239 = vmovshdup_avx(auVar65);
      fVar91 = auVar127._0_4_;
      fVar119 = auVar239._0_4_;
      fVar90 = auVar63._0_4_;
      if (((0.0001 <= fVar61) || (fVar91 <= -0.0001)) && (0.0001 <= fVar119 || fVar91 <= -0.0001))
      goto code_r0x01159abb;
      goto LAB_01159ae2;
    }
    local_238 = vinsertps_avx(auVar9,auVar12,0x10);
    goto LAB_011591ff;
  }
  if (bVar58) goto LAB_0115a5f0;
  fVar59 = ray->tfar;
  auVar85._4_4_ = fVar59;
  auVar85._0_4_ = fVar59;
  auVar85._8_4_ = fVar59;
  auVar85._12_4_ = fVar59;
  auVar9 = vcmpps_avx(local_248,auVar85,2);
  uVar48 = vmovmskps_avx(auVar9);
  uVar49 = (ulong)((uint)uVar49 & (uint)local_4d8 & uVar48);
  prim = local_4d0;
  goto LAB_01158b04;
code_r0x01159abb:
  auVar239 = vcmpps_avx(auVar239,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar64 = vcmpps_avx(auVar65,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar239 = vandps_avx(auVar64,auVar239);
  if (fVar90 <= -0.0001 || (auVar239 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_011597b0;
LAB_01159ae2:
  auVar64 = vcmpps_avx(auVar65,_DAT_01f45a50,1);
  auVar230 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar239 = vcmpss_avx(auVar63,ZEXT816(0) << 0x20,1);
  auVar97._8_4_ = 0x3f800000;
  auVar97._0_8_ = 0x3f8000003f800000;
  auVar97._12_4_ = 0x3f800000;
  auVar111._8_4_ = 0xbf800000;
  auVar111._0_8_ = 0xbf800000bf800000;
  auVar111._12_4_ = 0xbf800000;
  auVar239 = vblendvps_avx(auVar97,auVar111,auVar239);
  auVar64 = vblendvps_avx(auVar97,auVar111,auVar64);
  fVar216 = auVar64._0_4_;
  fVar144 = auVar239._0_4_;
  auVar239 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar216 == fVar144) && (!NAN(fVar216) && !NAN(fVar144))) {
    auVar239 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar216 == fVar144) && (!NAN(fVar216) && !NAN(fVar144))) {
    auVar230 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar64 = vmovshdup_avx(auVar64);
  fVar60 = auVar64._0_4_;
  if ((fVar216 != fVar60) || (NAN(fVar216) || NAN(fVar60))) {
    if ((fVar119 != fVar61) || (NAN(fVar119) || NAN(fVar61))) {
      auVar125._0_4_ = (float)((uint)fVar61 ^ local_328);
      auVar125._4_4_ = auVar65._4_4_ ^ uStack_324;
      auVar125._8_4_ = auVar65._8_4_ ^ uStack_320;
      auVar125._12_4_ = auVar65._12_4_ ^ uStack_31c;
      auVar126._0_4_ = auVar125._0_4_ / (fVar119 - fVar61);
      auVar126._4_12_ = auVar125._4_12_;
      auVar65 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar126._0_4_)),auVar126,ZEXT416(0));
      auVar64 = auVar65;
    }
    else {
      auVar65 = ZEXT816(0) << 0x20;
      if ((fVar61 != 0.0) || (auVar64 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar61))) {
        auVar65 = SUB6416(ZEXT464(0x7f800000),0);
        auVar64 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar239 = vminss_avx(auVar239,auVar65);
    auVar230 = vmaxss_avx(auVar64,auVar230);
  }
  auVar127 = vcmpss_avx(auVar127,ZEXT416(0),1);
  auVar98._8_4_ = 0x3f800000;
  auVar98._0_8_ = 0x3f8000003f800000;
  auVar98._12_4_ = 0x3f800000;
  auVar112._8_4_ = 0xbf800000;
  auVar112._0_8_ = 0xbf800000bf800000;
  auVar112._12_4_ = 0xbf800000;
  auVar127 = vblendvps_avx(auVar98,auVar112,auVar127);
  fVar119 = auVar127._0_4_;
  if ((fVar144 != fVar119) || (NAN(fVar144) || NAN(fVar119))) {
    if ((fVar91 != fVar90) || (NAN(fVar91) || NAN(fVar90))) {
      auVar78._0_4_ = (float)((uint)fVar90 ^ local_328);
      auVar78._4_4_ = auVar63._4_4_ ^ uStack_324;
      auVar78._8_4_ = auVar63._8_4_ ^ uStack_320;
      auVar78._12_4_ = auVar63._12_4_ ^ uStack_31c;
      auVar128._0_4_ = auVar78._0_4_ / (fVar91 - fVar90);
      auVar128._4_12_ = auVar78._4_12_;
      auVar127 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar128._0_4_)),auVar128,ZEXT416(0));
      auVar65 = auVar127;
    }
    else {
      auVar127 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar90 != 0.0) || (auVar65 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar90))) {
        auVar127 = SUB6416(ZEXT464(0xff800000),0);
        auVar65 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar239 = vminss_avx(auVar239,auVar65);
    auVar230 = vmaxss_avx(auVar127,auVar230);
  }
  if ((fVar60 != fVar119) || (NAN(fVar60) || NAN(fVar119))) {
    auVar239 = vminss_avx(auVar239,SUB6416(ZEXT464(0x3f800000),0));
    auVar230 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar230);
  }
  auVar127 = vmaxss_avx(ZEXT816(0) << 0x40,auVar239);
  auVar239 = vminss_avx(auVar230,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar239._0_4_ < auVar127._0_4_) goto LAB_011597b0;
  auVar127 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar127._0_4_ + -0.1)));
  auVar239 = vminss_avx(ZEXT416((uint)(auVar239._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar138._0_8_ = auVar108._0_8_;
  auVar138._8_8_ = auVar138._0_8_;
  auVar207._8_8_ = local_2a8._0_8_;
  auVar207._0_8_ = local_2a8._0_8_;
  auVar219._8_8_ = auVar62._0_8_;
  auVar219._0_8_ = auVar62._0_8_;
  auVar65 = vshufpd_avx(local_2a8._0_16_,local_2a8._0_16_,3);
  auVar64 = vshufpd_avx(auVar62,auVar62,3);
  auVar230 = vshufps_avx(auVar127,auVar239,0);
  auVar79._8_4_ = 0x3f800000;
  auVar79._0_8_ = 0x3f8000003f800000;
  auVar79._12_4_ = 0x3f800000;
  auVar108 = vsubps_avx(auVar79,auVar230);
  local_398._0_4_ = auVar10._0_4_;
  local_398._4_4_ = auVar10._4_4_;
  fStack_390 = auVar10._8_4_;
  fStack_38c = auVar10._12_4_;
  fVar119 = auVar230._0_4_;
  auVar80._0_4_ = fVar119 * (float)local_398._0_4_;
  fVar90 = auVar230._4_4_;
  auVar80._4_4_ = fVar90 * (float)local_398._4_4_;
  fVar91 = auVar230._8_4_;
  auVar80._8_4_ = fVar91 * fStack_390;
  fVar61 = auVar230._12_4_;
  auVar80._12_4_ = fVar61 * fStack_38c;
  auVar172._0_4_ = fVar119 * auVar65._0_4_;
  auVar172._4_4_ = fVar90 * auVar65._4_4_;
  auVar172._8_4_ = fVar91 * auVar65._8_4_;
  auVar172._12_4_ = fVar61 * auVar65._12_4_;
  auVar182._0_4_ = fVar119 * auVar64._0_4_;
  auVar182._4_4_ = fVar90 * auVar64._4_4_;
  auVar182._8_4_ = fVar91 * auVar64._8_4_;
  auVar182._12_4_ = fVar61 * auVar64._12_4_;
  auVar197._0_4_ = fVar119 * auVar11._0_4_;
  auVar197._4_4_ = fVar90 * auVar11._4_4_;
  auVar197._8_4_ = fVar91 * auVar11._8_4_;
  auVar197._12_4_ = fVar61 * auVar11._12_4_;
  auVar65 = vfmadd231ps_fma(auVar80,auVar108,auVar138);
  auVar64 = vfmadd231ps_fma(auVar172,auVar108,auVar207);
  auVar230 = vfmadd231ps_fma(auVar182,auVar108,auVar219);
  auVar108 = vfmadd231ps_fma(auVar197,auVar108,ZEXT816(0));
  auVar10 = vmovshdup_avx(auVar73);
  auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar127._0_4_)),auVar73,
                            ZEXT416((uint)(1.0 - auVar127._0_4_)));
  local_538 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar239._0_4_)),auVar73,
                              ZEXT416((uint)(1.0 - auVar239._0_4_)));
  fVar119 = 1.0 / fVar59;
  auVar127 = vsubps_avx(auVar64,auVar65);
  auVar208._0_4_ = auVar127._0_4_ * 3.0;
  auVar208._4_4_ = auVar127._4_4_ * 3.0;
  auVar208._8_4_ = auVar127._8_4_ * 3.0;
  auVar208._12_4_ = auVar127._12_4_ * 3.0;
  auVar127 = vsubps_avx(auVar230,auVar64);
  auVar220._0_4_ = auVar127._0_4_ * 3.0;
  auVar220._4_4_ = auVar127._4_4_ * 3.0;
  auVar220._8_4_ = auVar127._8_4_ * 3.0;
  auVar220._12_4_ = auVar127._12_4_ * 3.0;
  auVar127 = vsubps_avx(auVar108,auVar230);
  auVar231._0_4_ = auVar127._0_4_ * 3.0;
  auVar231._4_4_ = auVar127._4_4_ * 3.0;
  auVar231._8_4_ = auVar127._8_4_ * 3.0;
  auVar231._12_4_ = auVar127._12_4_ * 3.0;
  auVar10 = vminps_avx(auVar220,auVar231);
  auVar127 = vmaxps_avx(auVar220,auVar231);
  auVar10 = vminps_avx(auVar208,auVar10);
  auVar127 = vmaxps_avx(auVar208,auVar127);
  auVar11 = vshufpd_avx(auVar10,auVar10,3);
  auVar239 = vshufpd_avx(auVar127,auVar127,3);
  auVar10 = vminps_avx(auVar10,auVar11);
  auVar127 = vmaxps_avx(auVar127,auVar239);
  auVar221._0_4_ = auVar10._0_4_ * fVar119;
  auVar221._4_4_ = auVar10._4_4_ * fVar119;
  auVar221._8_4_ = auVar10._8_4_ * fVar119;
  auVar221._12_4_ = auVar10._12_4_ * fVar119;
  auVar209._0_4_ = auVar127._0_4_ * fVar119;
  auVar209._4_4_ = auVar127._4_4_ * fVar119;
  auVar209._8_4_ = auVar127._8_4_ * fVar119;
  auVar209._12_4_ = auVar127._12_4_ * fVar119;
  fVar119 = 1.0 / (local_538._0_4_ - auVar62._0_4_);
  auVar127 = vshufpd_avx(auVar65,auVar65,3);
  auVar10 = vshufpd_avx(auVar64,auVar64,3);
  auVar11 = vshufpd_avx(auVar230,auVar230,3);
  auVar239 = vshufpd_avx(auVar108,auVar108,3);
  auVar127 = vsubps_avx(auVar127,auVar65);
  auVar65 = vsubps_avx(auVar10,auVar64);
  auVar64 = vsubps_avx(auVar11,auVar230);
  auVar239 = vsubps_avx(auVar239,auVar108);
  auVar10 = vminps_avx(auVar127,auVar65);
  auVar127 = vmaxps_avx(auVar127,auVar65);
  auVar11 = vminps_avx(auVar64,auVar239);
  auVar11 = vminps_avx(auVar10,auVar11);
  auVar10 = vmaxps_avx(auVar64,auVar239);
  auVar127 = vmaxps_avx(auVar127,auVar10);
  auVar247._0_4_ = fVar119 * auVar11._0_4_;
  auVar247._4_4_ = fVar119 * auVar11._4_4_;
  auVar247._8_4_ = fVar119 * auVar11._8_4_;
  auVar247._12_4_ = fVar119 * auVar11._12_4_;
  auVar240._0_4_ = fVar119 * auVar127._0_4_;
  auVar240._4_4_ = fVar119 * auVar127._4_4_;
  auVar240._8_4_ = fVar119 * auVar127._8_4_;
  auVar240._12_4_ = fVar119 * auVar127._12_4_;
  auVar239 = vinsertps_avx(auVar9,auVar62,0x10);
  auVar65 = vinsertps_avx(auVar12,local_538,0x10);
  auVar232._0_4_ = (auVar239._0_4_ + auVar65._0_4_) * 0.5;
  auVar232._4_4_ = (auVar239._4_4_ + auVar65._4_4_) * 0.5;
  auVar232._8_4_ = (auVar239._8_4_ + auVar65._8_4_) * 0.5;
  auVar232._12_4_ = (auVar239._12_4_ + auVar65._12_4_) * 0.5;
  auVar81._4_4_ = auVar232._0_4_;
  auVar81._0_4_ = auVar232._0_4_;
  auVar81._8_4_ = auVar232._0_4_;
  auVar81._12_4_ = auVar232._0_4_;
  auVar127 = vfmadd213ps_fma(local_1e8,auVar81,local_4e8);
  auVar10 = vfmadd213ps_fma(local_1f8,auVar81,local_4f8);
  auVar11 = vfmadd213ps_fma(local_208,auVar81,local_508);
  auVar12 = vsubps_avx(auVar10,auVar127);
  auVar127 = vfmadd213ps_fma(auVar12,auVar81,auVar127);
  auVar12 = vsubps_avx(auVar11,auVar10);
  auVar12 = vfmadd213ps_fma(auVar12,auVar81,auVar10);
  auVar12 = vsubps_avx(auVar12,auVar127);
  auVar127 = vfmadd231ps_fma(auVar127,auVar12,auVar81);
  auVar82._0_8_ = CONCAT44(auVar12._4_4_ * 3.0,auVar12._0_4_ * 3.0);
  auVar82._8_4_ = auVar12._8_4_ * 3.0;
  auVar82._12_4_ = auVar12._12_4_ * 3.0;
  auVar256._8_8_ = auVar127._0_8_;
  auVar256._0_8_ = auVar127._0_8_;
  auVar12 = vshufpd_avx(auVar127,auVar127,3);
  auVar127 = vshufps_avx(auVar232,auVar232,0x55);
  auVar230 = vsubps_avx(auVar12,auVar256);
  auVar63 = vfmadd231ps_fma(auVar256,auVar127,auVar230);
  auVar261._8_8_ = auVar82._0_8_;
  auVar261._0_8_ = auVar82._0_8_;
  auVar12 = vshufpd_avx(auVar82,auVar82,3);
  auVar12 = vsubps_avx(auVar12,auVar261);
  auVar108 = vfmadd213ps_fma(auVar12,auVar127,auVar261);
  auVar127 = vmovshdup_avx(auVar108);
  auVar262._0_8_ = auVar127._0_8_ ^ 0x8000000080000000;
  auVar262._8_4_ = auVar127._8_4_ ^ 0x80000000;
  auVar262._12_4_ = auVar127._12_4_ ^ 0x80000000;
  auVar10 = vmovshdup_avx(auVar230);
  auVar12 = vunpcklps_avx(auVar10,auVar262);
  auVar11 = vshufps_avx(auVar12,auVar262,4);
  auVar64 = vshufps_avx(auVar232,auVar232,0x54);
  auVar129._0_8_ = auVar230._0_8_ ^ 0x8000000080000000;
  auVar129._8_4_ = auVar230._8_4_ ^ 0x80000000;
  auVar129._12_4_ = auVar230._12_4_ ^ 0x80000000;
  auVar12 = vmovlhps_avx(auVar129,auVar108);
  auVar12 = vshufps_avx(auVar12,auVar108,8);
  auVar127 = vfmsub231ss_fma(ZEXT416((uint)(auVar230._0_4_ * auVar127._0_4_)),auVar10,auVar108);
  uVar57 = auVar127._0_4_;
  auVar83._4_4_ = uVar57;
  auVar83._0_4_ = uVar57;
  auVar83._8_4_ = uVar57;
  auVar83._12_4_ = uVar57;
  auVar127 = vdivps_avx(auVar11,auVar83);
  auVar10 = vdivps_avx(auVar12,auVar83);
  fVar91 = auVar63._0_4_;
  fVar119 = auVar127._0_4_;
  auVar12 = vshufps_avx(auVar63,auVar63,0x55);
  fVar90 = auVar10._0_4_;
  auVar84._0_4_ = fVar91 * fVar119 + auVar12._0_4_ * fVar90;
  auVar84._4_4_ = fVar91 * auVar127._4_4_ + auVar12._4_4_ * auVar10._4_4_;
  auVar84._8_4_ = fVar91 * auVar127._8_4_ + auVar12._8_4_ * auVar10._8_4_;
  auVar84._12_4_ = fVar91 * auVar127._12_4_ + auVar12._12_4_ * auVar10._12_4_;
  auVar133 = vsubps_avx(auVar64,auVar84);
  auVar64 = vmovshdup_avx(auVar127);
  auVar12 = vinsertps_avx(auVar221,auVar247,0x1c);
  auVar149._0_4_ = auVar64._0_4_ * auVar12._0_4_;
  auVar149._4_4_ = auVar64._4_4_ * auVar12._4_4_;
  auVar149._8_4_ = auVar64._8_4_ * auVar12._8_4_;
  auVar149._12_4_ = auVar64._12_4_ * auVar12._12_4_;
  auVar11 = vinsertps_avx(auVar209,auVar240,0x1c);
  auVar99._0_4_ = auVar11._0_4_ * auVar64._0_4_;
  auVar99._4_4_ = auVar11._4_4_ * auVar64._4_4_;
  auVar99._8_4_ = auVar11._8_4_ * auVar64._8_4_;
  auVar99._12_4_ = auVar11._12_4_ * auVar64._12_4_;
  auVar63 = vminps_avx(auVar149,auVar99);
  auVar108 = vmaxps_avx(auVar99,auVar149);
  auVar64 = vinsertps_avx(auVar247,auVar221,0x4c);
  auVar124 = vmovshdup_avx(auVar10);
  auVar230 = vinsertps_avx(auVar240,auVar209,0x4c);
  auVar241._0_4_ = auVar124._0_4_ * auVar64._0_4_;
  auVar241._4_4_ = auVar124._4_4_ * auVar64._4_4_;
  auVar241._8_4_ = auVar124._8_4_ * auVar64._8_4_;
  auVar241._12_4_ = auVar124._12_4_ * auVar64._12_4_;
  auVar222._0_4_ = auVar124._0_4_ * auVar230._0_4_;
  auVar222._4_4_ = auVar124._4_4_ * auVar230._4_4_;
  auVar222._8_4_ = auVar124._8_4_ * auVar230._8_4_;
  auVar222._12_4_ = auVar124._12_4_ * auVar230._12_4_;
  auVar124 = vminps_avx(auVar241,auVar222);
  auVar248._0_4_ = auVar63._0_4_ + auVar124._0_4_;
  auVar248._4_4_ = auVar63._4_4_ + auVar124._4_4_;
  auVar248._8_4_ = auVar63._8_4_ + auVar124._8_4_;
  auVar248._12_4_ = auVar63._12_4_ + auVar124._12_4_;
  auVar63 = vmaxps_avx(auVar222,auVar241);
  auVar100._0_4_ = auVar63._0_4_ + auVar108._0_4_;
  auVar100._4_4_ = auVar63._4_4_ + auVar108._4_4_;
  auVar100._8_4_ = auVar63._8_4_ + auVar108._8_4_;
  auVar100._12_4_ = auVar63._12_4_ + auVar108._12_4_;
  auVar223._8_8_ = 0x3f80000000000000;
  auVar223._0_8_ = 0x3f80000000000000;
  auVar108 = vsubps_avx(auVar223,auVar100);
  auVar63 = vsubps_avx(auVar223,auVar248);
  auVar124 = vsubps_avx(auVar239,auVar232);
  auVar120 = vsubps_avx(auVar65,auVar232);
  auVar113._0_4_ = fVar119 * auVar12._0_4_;
  auVar113._4_4_ = fVar119 * auVar12._4_4_;
  auVar113._8_4_ = fVar119 * auVar12._8_4_;
  auVar113._12_4_ = fVar119 * auVar12._12_4_;
  auVar249._0_4_ = fVar119 * auVar11._0_4_;
  auVar249._4_4_ = fVar119 * auVar11._4_4_;
  auVar249._8_4_ = fVar119 * auVar11._8_4_;
  auVar249._12_4_ = fVar119 * auVar11._12_4_;
  auVar11 = vminps_avx(auVar113,auVar249);
  auVar12 = vmaxps_avx(auVar249,auVar113);
  auVar150._0_4_ = fVar90 * auVar64._0_4_;
  auVar150._4_4_ = fVar90 * auVar64._4_4_;
  auVar150._8_4_ = fVar90 * auVar64._8_4_;
  auVar150._12_4_ = fVar90 * auVar64._12_4_;
  auVar210._0_4_ = fVar90 * auVar230._0_4_;
  auVar210._4_4_ = fVar90 * auVar230._4_4_;
  auVar210._8_4_ = fVar90 * auVar230._8_4_;
  auVar210._12_4_ = fVar90 * auVar230._12_4_;
  auVar64 = vminps_avx(auVar150,auVar210);
  auVar250._0_4_ = auVar11._0_4_ + auVar64._0_4_;
  auVar250._4_4_ = auVar11._4_4_ + auVar64._4_4_;
  auVar250._8_4_ = auVar11._8_4_ + auVar64._8_4_;
  auVar250._12_4_ = auVar11._12_4_ + auVar64._12_4_;
  fVar60 = auVar124._0_4_;
  auVar257._0_4_ = fVar60 * auVar108._0_4_;
  fVar175 = auVar124._4_4_;
  auVar257._4_4_ = fVar175 * auVar108._4_4_;
  fVar189 = auVar124._8_4_;
  auVar257._8_4_ = fVar189 * auVar108._8_4_;
  fVar190 = auVar124._12_4_;
  auVar257._12_4_ = fVar190 * auVar108._12_4_;
  auVar11 = vmaxps_avx(auVar210,auVar150);
  auVar211._0_4_ = fVar60 * auVar63._0_4_;
  auVar211._4_4_ = fVar175 * auVar63._4_4_;
  auVar211._8_4_ = fVar189 * auVar63._8_4_;
  auVar211._12_4_ = fVar190 * auVar63._12_4_;
  fVar91 = auVar120._0_4_;
  auVar101._0_4_ = fVar91 * auVar108._0_4_;
  fVar61 = auVar120._4_4_;
  auVar101._4_4_ = fVar61 * auVar108._4_4_;
  fVar144 = auVar120._8_4_;
  auVar101._8_4_ = fVar144 * auVar108._8_4_;
  fVar216 = auVar120._12_4_;
  auVar101._12_4_ = fVar216 * auVar108._12_4_;
  auVar224._0_4_ = fVar91 * auVar63._0_4_;
  auVar224._4_4_ = fVar61 * auVar63._4_4_;
  auVar224._8_4_ = fVar144 * auVar63._8_4_;
  auVar224._12_4_ = fVar216 * auVar63._12_4_;
  auVar114._0_4_ = auVar12._0_4_ + auVar11._0_4_;
  auVar114._4_4_ = auVar12._4_4_ + auVar11._4_4_;
  auVar114._8_4_ = auVar12._8_4_ + auVar11._8_4_;
  auVar114._12_4_ = auVar12._12_4_ + auVar11._12_4_;
  auVar151._8_8_ = 0x3f800000;
  auVar151._0_8_ = 0x3f800000;
  auVar12 = vsubps_avx(auVar151,auVar114);
  auVar11 = vsubps_avx(auVar151,auVar250);
  auVar251._0_4_ = fVar60 * auVar12._0_4_;
  auVar251._4_4_ = fVar175 * auVar12._4_4_;
  auVar251._8_4_ = fVar189 * auVar12._8_4_;
  auVar251._12_4_ = fVar190 * auVar12._12_4_;
  auVar242._0_4_ = fVar60 * auVar11._0_4_;
  auVar242._4_4_ = fVar175 * auVar11._4_4_;
  auVar242._8_4_ = fVar189 * auVar11._8_4_;
  auVar242._12_4_ = fVar190 * auVar11._12_4_;
  auVar115._0_4_ = fVar91 * auVar12._0_4_;
  auVar115._4_4_ = fVar61 * auVar12._4_4_;
  auVar115._8_4_ = fVar144 * auVar12._8_4_;
  auVar115._12_4_ = fVar216 * auVar12._12_4_;
  auVar152._0_4_ = fVar91 * auVar11._0_4_;
  auVar152._4_4_ = fVar61 * auVar11._4_4_;
  auVar152._8_4_ = fVar144 * auVar11._8_4_;
  auVar152._12_4_ = fVar216 * auVar11._12_4_;
  auVar12 = vminps_avx(auVar251,auVar242);
  auVar11 = vminps_avx(auVar115,auVar152);
  auVar12 = vminps_avx(auVar12,auVar11);
  auVar11 = vmaxps_avx(auVar242,auVar251);
  auVar64 = vmaxps_avx(auVar152,auVar115);
  auVar230 = vminps_avx(auVar257,auVar211);
  auVar108 = vminps_avx(auVar101,auVar224);
  auVar230 = vminps_avx(auVar230,auVar108);
  auVar12 = vhaddps_avx(auVar12,auVar230);
  auVar11 = vmaxps_avx(auVar64,auVar11);
  auVar64 = vmaxps_avx(auVar211,auVar257);
  auVar230 = vmaxps_avx(auVar224,auVar101);
  auVar64 = vmaxps_avx(auVar230,auVar64);
  auVar11 = vhaddps_avx(auVar11,auVar64);
  auVar12 = vshufps_avx(auVar12,auVar12,0xe8);
  auVar11 = vshufps_avx(auVar11,auVar11,0xe8);
  auVar225._0_4_ = auVar133._0_4_ + auVar12._0_4_;
  auVar225._4_4_ = auVar133._4_4_ + auVar12._4_4_;
  auVar225._8_4_ = auVar133._8_4_ + auVar12._8_4_;
  auVar225._12_4_ = auVar133._12_4_ + auVar12._12_4_;
  auVar212._0_4_ = auVar133._0_4_ + auVar11._0_4_;
  auVar212._4_4_ = auVar133._4_4_ + auVar11._4_4_;
  auVar212._8_4_ = auVar133._8_4_ + auVar11._8_4_;
  auVar212._12_4_ = auVar133._12_4_ + auVar11._12_4_;
  auVar215 = ZEXT1664(auVar212);
  auVar12 = vmaxps_avx(auVar239,auVar225);
  auVar11 = vminps_avx(auVar212,auVar65);
  auVar12 = vcmpps_avx(auVar11,auVar12,1);
  auVar12 = vshufps_avx(auVar12,auVar12,0x50);
  if ((auVar12 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar12[0xf] < '\0')
  goto LAB_011597b0;
  bVar52 = 0;
  if ((auVar188._0_4_ < auVar225._0_4_) && (bVar52 = 0, auVar212._0_4_ < auVar65._0_4_)) {
    auVar11 = vmovshdup_avx(auVar225);
    auVar12 = vcmpps_avx(auVar212,auVar65,1);
    bVar52 = auVar12[4] & auVar62._0_4_ < auVar11._0_4_;
  }
  auVar215 = ZEXT464(0x40400000);
  if (((3 < (uint)uVar54 || fVar59 < 0.001) | bVar52) != 1) goto LAB_0115a5b3;
  lVar51 = 0xc9;
  do {
    lVar51 = lVar51 + -1;
    if (lVar51 == 0) goto LAB_011597b0;
    fVar61 = auVar133._0_4_;
    fVar91 = 1.0 - fVar61;
    fVar59 = fVar91 * fVar91 * fVar91;
    fVar89 = fVar61 * 3.0 * fVar91 * fVar91;
    fVar91 = fVar91 * fVar61 * fVar61 * 3.0;
    auVar139._4_4_ = fVar59;
    auVar139._0_4_ = fVar59;
    auVar139._8_4_ = fVar59;
    auVar139._12_4_ = fVar59;
    auVar116._4_4_ = fVar89;
    auVar116._0_4_ = fVar89;
    auVar116._8_4_ = fVar89;
    auVar116._12_4_ = fVar89;
    auVar102._4_4_ = fVar91;
    auVar102._0_4_ = fVar91;
    auVar102._8_4_ = fVar91;
    auVar102._12_4_ = fVar91;
    fVar61 = fVar61 * fVar61 * fVar61;
    auVar153._0_4_ = (float)local_218._0_4_ * fVar61;
    auVar153._4_4_ = (float)local_218._4_4_ * fVar61;
    auVar153._8_4_ = fStack_210 * fVar61;
    auVar153._12_4_ = fStack_20c * fVar61;
    auVar9 = vfmadd231ps_fma(auVar153,local_508,auVar102);
    auVar9 = vfmadd231ps_fma(auVar9,local_4f8,auVar116);
    auVar9 = vfmadd231ps_fma(auVar9,local_4e8,auVar139);
    auVar103._8_8_ = auVar9._0_8_;
    auVar103._0_8_ = auVar9._0_8_;
    auVar9 = vshufpd_avx(auVar9,auVar9,3);
    auVar12 = vshufps_avx(auVar133,auVar133,0x55);
    auVar9 = vsubps_avx(auVar9,auVar103);
    auVar12 = vfmadd213ps_fma(auVar9,auVar12,auVar103);
    fVar59 = auVar12._0_4_;
    auVar9 = vshufps_avx(auVar12,auVar12,0x55);
    auVar104._0_4_ = fVar119 * fVar59 + fVar90 * auVar9._0_4_;
    auVar104._4_4_ = auVar127._4_4_ * fVar59 + auVar10._4_4_ * auVar9._4_4_;
    auVar104._8_4_ = auVar127._8_4_ * fVar59 + auVar10._8_4_ * auVar9._8_4_;
    auVar104._12_4_ = auVar127._12_4_ * fVar59 + auVar10._12_4_ * auVar9._12_4_;
    auVar133 = vsubps_avx(auVar133,auVar104);
    auVar9 = vandps_avx(local_318,auVar12);
    auVar12 = vshufps_avx(auVar9,auVar9,0xf5);
    auVar9 = vmaxss_avx(auVar12,auVar9);
  } while ((float)local_228._0_4_ <= auVar9._0_4_);
  fVar59 = auVar133._0_4_;
  if ((fVar59 < 0.0) || (1.0 < fVar59)) goto LAB_011597b0;
  auVar9 = vmovshdup_avx(auVar133);
  fVar89 = auVar9._0_4_;
  if ((fVar89 < 0.0) || (1.0 < fVar89)) goto LAB_011597b0;
  auVar9 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                         ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar64 = vinsertps_avx(auVar9,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar1 = (ray->org).field_0;
  auVar9 = vsubps_avx(local_458,(undefined1  [16])aVar1);
  auVar9 = vdpps_avx(auVar9,auVar64,0x7f);
  auVar12 = vsubps_avx(local_488,(undefined1  [16])aVar1);
  auVar12 = vdpps_avx(auVar12,auVar64,0x7f);
  auVar127 = vsubps_avx(local_498,(undefined1  [16])aVar1);
  auVar127 = vdpps_avx(auVar127,auVar64,0x7f);
  auVar10 = vsubps_avx(local_478,(undefined1  [16])aVar1);
  auVar10 = vdpps_avx(auVar10,auVar64,0x7f);
  auVar11 = vsubps_avx(_local_468,(undefined1  [16])aVar1);
  auVar11 = vdpps_avx(auVar11,auVar64,0x7f);
  auVar239 = vsubps_avx(_local_4a8,(undefined1  [16])aVar1);
  auVar239 = vdpps_avx(auVar239,auVar64,0x7f);
  auVar65 = vsubps_avx(_local_4b8,(undefined1  [16])aVar1);
  auVar65 = vdpps_avx(auVar65,auVar64,0x7f);
  auVar44._4_4_ = fStack_4c4;
  auVar44._0_4_ = local_4c8;
  auVar44._8_4_ = fStack_4c0;
  auVar44._12_4_ = fStack_4bc;
  auVar230 = vsubps_avx(auVar44,(undefined1  [16])aVar1);
  auVar64 = vdpps_avx(auVar230,auVar64,0x7f);
  fVar119 = 1.0 - fVar89;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * fVar89)),ZEXT416((uint)fVar119),auVar9);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar239._0_4_ * fVar89)),ZEXT416((uint)fVar119),auVar12)
  ;
  auVar127 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * fVar89)),ZEXT416((uint)fVar119),auVar127
                            );
  auVar215 = ZEXT1664(auVar127);
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar89 * auVar64._0_4_)),ZEXT416((uint)fVar119),auVar10);
  fVar91 = 1.0 - fVar59;
  fVar89 = fVar91 * fVar59 * fVar59 * 3.0;
  fVar144 = fVar59 * fVar59 * fVar59;
  auVar127 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * fVar144)),ZEXT416((uint)fVar89),auVar127
                            );
  fVar119 = fVar59 * 3.0 * fVar91 * fVar91;
  auVar12 = vfmadd231ss_fma(auVar127,ZEXT416((uint)fVar119),auVar12);
  fVar90 = fVar91 * fVar91 * fVar91;
  auVar9 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar90),auVar9);
  fVar61 = auVar9._0_4_;
  if ((fVar61 < (ray->org).field_0.m128[3]) || (ray->tfar < fVar61)) goto LAB_011597b0;
  pGVar4 = (context->scene->geometries).items[uVar48].ptr;
  if ((pGVar4->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar52 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0115a547;
    local_528._0_4_ = ray->tfar;
    auVar9 = vshufps_avx(auVar133,auVar133,0x55);
    auVar198._8_4_ = 0x3f800000;
    auVar198._0_8_ = 0x3f8000003f800000;
    auVar198._12_4_ = 0x3f800000;
    auVar12 = vsubps_avx(auVar198,auVar9);
    fVar216 = auVar9._0_4_;
    auVar213._0_4_ = fVar216 * (float)local_468._0_4_;
    fVar60 = auVar9._4_4_;
    auVar213._4_4_ = fVar60 * (float)local_468._4_4_;
    fVar175 = auVar9._8_4_;
    auVar213._8_4_ = fVar175 * fStack_460;
    fVar189 = auVar9._12_4_;
    auVar213._12_4_ = fVar189 * fStack_45c;
    auVar226._0_4_ = fVar216 * (float)local_4a8._0_4_;
    auVar226._4_4_ = fVar60 * (float)local_4a8._4_4_;
    auVar226._8_4_ = fVar175 * fStack_4a0;
    auVar226._12_4_ = fVar189 * fStack_49c;
    auVar233._0_4_ = fVar216 * (float)local_4b8._0_4_;
    auVar233._4_4_ = fVar60 * (float)local_4b8._4_4_;
    auVar233._8_4_ = fVar175 * fStack_4b0;
    auVar233._12_4_ = fVar189 * fStack_4ac;
    auVar183._0_4_ = fVar216 * local_4c8;
    auVar183._4_4_ = fVar60 * fStack_4c4;
    auVar183._8_4_ = fVar175 * fStack_4c0;
    auVar183._12_4_ = fVar189 * fStack_4bc;
    auVar9 = vfmadd231ps_fma(auVar213,auVar12,local_458);
    auVar127 = vfmadd231ps_fma(auVar226,auVar12,local_488);
    auVar10 = vfmadd231ps_fma(auVar233,auVar12,local_498);
    auVar11 = vfmadd231ps_fma(auVar183,auVar12,local_478);
    auVar9 = vsubps_avx(auVar127,auVar9);
    auVar12 = vsubps_avx(auVar10,auVar127);
    auVar215 = ZEXT1664(auVar12);
    auVar127 = vsubps_avx(auVar11,auVar10);
    auVar234._0_4_ = fVar59 * auVar12._0_4_;
    auVar234._4_4_ = fVar59 * auVar12._4_4_;
    auVar234._8_4_ = fVar59 * auVar12._8_4_;
    auVar234._12_4_ = fVar59 * auVar12._12_4_;
    auVar173._4_4_ = fVar91;
    auVar173._0_4_ = fVar91;
    auVar173._8_4_ = fVar91;
    auVar173._12_4_ = fVar91;
    auVar9 = vfmadd231ps_fma(auVar234,auVar173,auVar9);
    auVar184._0_4_ = fVar59 * auVar127._0_4_;
    auVar184._4_4_ = fVar59 * auVar127._4_4_;
    auVar184._8_4_ = fVar59 * auVar127._8_4_;
    auVar184._12_4_ = fVar59 * auVar127._12_4_;
    auVar127 = vfmadd231ps_fma(auVar184,auVar173,auVar12);
    auVar185._0_4_ = fVar59 * auVar127._0_4_;
    auVar185._4_4_ = fVar59 * auVar127._4_4_;
    auVar185._8_4_ = fVar59 * auVar127._8_4_;
    auVar185._12_4_ = fVar59 * auVar127._12_4_;
    auVar127 = vfmadd231ps_fma(auVar185,auVar173,auVar9);
    auVar154._0_4_ = fVar144 * (float)local_288._0_4_;
    auVar154._4_4_ = fVar144 * (float)local_288._4_4_;
    auVar154._8_4_ = fVar144 * fStack_280;
    auVar154._12_4_ = fVar144 * fStack_27c;
    auVar117._4_4_ = fVar89;
    auVar117._0_4_ = fVar89;
    auVar117._8_4_ = fVar89;
    auVar117._12_4_ = fVar89;
    auVar9 = vfmadd132ps_fma(auVar117,auVar154,local_278);
    auVar140._4_4_ = fVar119;
    auVar140._0_4_ = fVar119;
    auVar140._8_4_ = fVar119;
    auVar140._12_4_ = fVar119;
    auVar9 = vfmadd132ps_fma(auVar140,auVar9,local_268);
    auVar118._0_4_ = auVar127._0_4_ * 3.0;
    auVar118._4_4_ = auVar127._4_4_ * 3.0;
    auVar118._8_4_ = auVar127._8_4_ * 3.0;
    auVar118._12_4_ = auVar127._12_4_ * 3.0;
    auVar130._4_4_ = fVar90;
    auVar130._0_4_ = fVar90;
    auVar130._8_4_ = fVar90;
    auVar130._12_4_ = fVar90;
    auVar127 = vfmadd132ps_fma(auVar130,auVar9,local_258);
    auVar9 = vshufps_avx(auVar118,auVar118,0xc9);
    auVar141._0_4_ = auVar127._0_4_ * auVar9._0_4_;
    auVar141._4_4_ = auVar127._4_4_ * auVar9._4_4_;
    auVar141._8_4_ = auVar127._8_4_ * auVar9._8_4_;
    auVar141._12_4_ = auVar127._12_4_ * auVar9._12_4_;
    auVar9 = vshufps_avx(auVar127,auVar127,0xc9);
    auVar127 = vfmsub231ps_fma(auVar141,auVar118,auVar9);
    auVar9 = vshufps_avx(auVar127,auVar127,0xe9);
    local_2d8 = vmovlps_avx(auVar9);
    local_2d0 = auVar127._0_4_;
    local_2cc = vmovlps_avx(auVar133);
    local_2c4 = (int)local_3a0;
    local_2c0 = uVar48;
    local_2bc = context->user->instID[0];
    local_2b8 = context->user->instPrimID[0];
    ray->tfar = fVar61;
    local_53c = -1;
    local_358.geometryUserPtr = pGVar4->userPtr;
    local_358.context = context->user;
    local_358.hit = (RTCHitN *)&local_2d8;
    local_358.N = 1;
    local_358.ray = (RTCRayN *)ray;
    if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0115a4e4:
      p_Var7 = context->args->filter;
      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
        auVar215 = ZEXT1664(auVar215._0_16_);
        (*p_Var7)(&local_358);
        if (*local_358.valid == 0) goto LAB_0115a538;
      }
      bVar52 = 1;
      goto LAB_0115a547;
    }
    local_538._0_8_ = context;
    auVar215 = ZEXT1664(auVar12);
    (*pGVar4->occlusionFilterN)(&local_358);
    context = (RayQueryContext *)local_538._0_8_;
    if (*local_358.valid != 0) goto LAB_0115a4e4;
LAB_0115a538:
    ray->tfar = (float)local_528._0_4_;
  }
  bVar52 = 0;
LAB_0115a547:
  bVar58 = (bool)(bVar58 | bVar52);
  pre = local_3a8;
  goto LAB_011597b0;
LAB_0115a5b3:
  local_238 = vinsertps_avx(auVar9,ZEXT416((uint)fVar89),0x10);
  auVar73 = vinsertps_avx(auVar62,ZEXT416((uint)local_538._0_4_),0x10);
  goto LAB_011591ff;
}

Assistant:

static __forceinline bool occluded_hn(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }